

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

void secp256k1_scalar_verify(secp256k1_scalar *r)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined8 uVar62;
  uint uVar63;
  undefined4 extraout_EAX;
  int iVar64;
  ulong uVar65;
  ulong uVar66;
  secp256k1_gej *psVar67;
  int64_t iVar68;
  int64_t iVar69;
  uint64_t *puVar70;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  long lVar71;
  byte bVar72;
  undefined4 uVar73;
  int iVar74;
  uint uVar75;
  secp256k1_modinv64_signed62 *psVar76;
  secp256k1_modinv64_signed62 *psVar77;
  secp256k1_scalar *r_00;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong *extraout_RDX;
  long lVar83;
  long lVar84;
  secp256k1_gej *psVar85;
  secp256k1_gej *psVar86;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  secp256k1_modinv64_signed62 *a;
  long *extraout_RDX_09;
  long lVar87;
  secp256k1_modinv64_signed62 *b;
  secp256k1_gej *psVar88;
  secp256k1_gej *psVar89;
  ulong uVar90;
  uint uVar91;
  secp256k1_gej *psVar92;
  long lVar93;
  secp256k1_fe *a_00;
  secp256k1_gej *a_01;
  secp256k1_gej *psVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  secp256k1_gej *psVar99;
  secp256k1_gej *psVar100;
  ulong uVar101;
  ulong uVar102;
  ulong uVar103;
  secp256k1_gej *psVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  secp256k1_gej *psVar110;
  undefined1 *puVar111;
  secp256k1_gej *psVar112;
  secp256k1_gej *psVar113;
  ulong uVar114;
  ulong uVar115;
  long lVar116;
  ulong uVar117;
  long lVar118;
  secp256k1_modinv64_signed62 *psVar119;
  bool bVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  secp256k1_modinv64_signed62 sStack_470;
  secp256k1_modinv64_signed62 sStack_448;
  secp256k1_gej *psStack_420;
  secp256k1_gej *psStack_418;
  secp256k1_modinv64_signed62 *psStack_410;
  ulong uStack_408;
  secp256k1_gej *psStack_400;
  ulong uStack_3f8;
  secp256k1_gej *psStack_3f0;
  secp256k1_modinv64_signed62 *psStack_3e8;
  secp256k1_gej *psStack_3e0;
  uint64_t uStack_3d8;
  uint64_t uStack_3d0;
  secp256k1_gej *psStack_3c8;
  uint64_t uStack_3c0;
  uint64_t uStack_3b8;
  uint64_t uStack_3b0;
  uint64_t uStack_3a8;
  uint64_t uStack_3a0;
  secp256k1_gej *psStack_398;
  secp256k1_gej *psStack_390;
  secp256k1_gej *psStack_388;
  secp256k1_gej *psStack_380;
  secp256k1_gej *psStack_378;
  long lStack_370;
  secp256k1_gej *psStack_368;
  code *pcStack_360;
  uint uStack_354;
  ulong uStack_350;
  secp256k1_gej *apsStack_348 [2];
  undefined1 auStack_338 [56];
  uint64_t auStack_300 [5];
  secp256k1_modinv64_trans2x2 sStack_2d8;
  undefined1 auStack_2b8 [96];
  secp256k1_gej *psStack_258;
  ulong uStack_250;
  secp256k1_gej *psStack_248;
  ulong uStack_240;
  secp256k1_gej *psStack_238;
  secp256k1_gej *psStack_228;
  secp256k1_gej *psStack_220;
  secp256k1_gej *psStack_210;
  secp256k1_fe *psStack_208;
  secp256k1_fe sStack_200;
  ulong uStack_1d0;
  ulong uStack_1c8;
  code *pcStack_1c0;
  ulong uStack_1b0;
  ulong uStack_1a8;
  ulong uStack_1a0;
  ulong uStack_198;
  ulong uStack_190;
  ulong uStack_188;
  secp256k1_gej *psStack_180;
  ulong uStack_178;
  ulong uStack_170;
  ulong uStack_168;
  ulong uStack_160;
  ulong uStack_158;
  ulong uStack_150;
  ulong uStack_148;
  ulong uStack_140;
  ulong uStack_138;
  ulong uStack_130;
  ulong uStack_128;
  ulong uStack_120;
  secp256k1_gej *psStack_118;
  ulong uStack_110;
  ulong uStack_108;
  ulong uStack_100;
  ulong uStack_f8;
  ulong uStack_f0;
  ulong uStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  ulong uStack_c0;
  undefined1 auStack_b8 [16];
  secp256k1_gej *psStack_a0;
  ulong uStack_98;
  ulong uStack_90;
  secp256k1_modinv64_signed62 *psStack_88;
  ulong uStack_80;
  code *pcStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  secp256k1_modinv64_signed62 sStack_60;
  secp256k1_scalar *r_01;
  
  bVar120 = r->d[3] == 0xffffffffffffffff;
  uVar75 = (uint)((0xfffffffffffffffd < r->d[2] && bVar120) && 0xbaaedce6af48a03a < r->d[1]);
  uVar91 = 0;
  if (0xbaaedce6af48a03b < r->d[1]) {
    uVar91 = uVar75;
  }
  uVar91 = uVar91 | (r->d[2] == 0xffffffffffffffff && bVar120);
  r_01 = (secp256k1_scalar *)(ulong)uVar91;
  uVar63 = 0;
  if (0xbfd25e8cd0364140 < r->d[0]) {
    uVar63 = uVar75;
  }
  if (uVar63 == 0 && uVar91 == 0) {
    return;
  }
  secp256k1_scalar_verify_cold_1();
  pcStack_78 = (code *)0x14109b;
  secp256k1_scalar_verify(r_01);
  uStack_70 = r_01->d[2] | r_01->d[0];
  uStack_68 = r_01->d[3] | r_01->d[1];
  pcStack_78 = (code *)0x1410b3;
  secp256k1_scalar_verify(r_01);
  uVar114 = r_01->d[0];
  uVar115 = r_01->d[1];
  uVar66 = r_01->d[2];
  uVar90 = r_01->d[3];
  pcStack_78 = (code *)0x1410ca;
  secp256k1_scalar_verify(r_01);
  uVar73 = 0xffffffff;
  uVar117 = uVar114 & 0x3fffffffffffffff;
  uVar114 = (uVar115 & 0xfffffffffffffff) << 2 | uVar114 >> 0x3e;
  uVar115 = (uVar66 & 0x3ffffffffffffff) << 4 | uVar115 >> 0x3c;
  sStack_60.v[3] = (uVar90 & 0xffffffffffffff) << 6 | uVar66 >> 0x3a;
  uVar90 = uVar90 >> 0x38;
  pcStack_78 = (code *)0x14111d;
  sStack_60.v[0] = uVar117;
  sStack_60.v[1] = uVar114;
  sStack_60.v[2] = uVar115;
  sStack_60.v[4] = uVar90;
  secp256k1_modinv64_var(&sStack_60,&secp256k1_const_modinfo_scalar);
  pcStack_78 = (code *)0x141128;
  psVar76 = &sStack_60;
  secp256k1_scalar_from_signed62(r,&sStack_60);
  pcStack_78 = (code *)0x141130;
  secp256k1_scalar_verify(r);
  pcStack_78 = (code *)0x141138;
  psVar89 = (secp256k1_gej *)r;
  secp256k1_scalar_verify(r);
  auVar121._0_4_ =
       -(uint)((int)(((secp256k1_gej *)r)->x).n[2] == 0 && (int)(((secp256k1_gej *)r)->x).n[0] == 0)
  ;
  auVar121._4_4_ =
       -(uint)(*(int *)((long)(((secp256k1_gej *)r)->x).n + 0x14) == 0 &&
              *(int *)((long)(((secp256k1_gej *)r)->x).n + 4) == 0);
  auVar121._8_4_ =
       -(uint)((int)(((secp256k1_gej *)r)->x).n[3] == 0 && (int)(((secp256k1_gej *)r)->x).n[1] == 0)
  ;
  auVar121._12_4_ =
       -(uint)(*(int *)((long)(((secp256k1_gej *)r)->x).n + 0x1c) == 0 &&
              *(int *)((long)(((secp256k1_gej *)r)->x).n + 0xc) == 0);
  iVar64 = movmskps(extraout_EAX,auVar121);
  auVar122._0_4_ = -(uint)((int)uStack_70 == 0);
  auVar122._4_4_ = -(uint)(uStack_70._4_4_ == 0);
  auVar122._8_4_ = -(uint)((int)uStack_68 == 0);
  auVar122._12_4_ = -(uint)(uStack_68._4_4_ == 0);
  iVar74 = movmskps(uVar73,auVar122);
  if ((iVar74 != 0xf) != (iVar64 == 0xf)) {
    return;
  }
  pcStack_78 = secp256k1_scalar_mul;
  secp256k1_scalar_inverse_var_cold_1();
  pcStack_1c0 = (code *)0x1411a2;
  psStack_a0 = (secp256k1_gej *)r;
  uStack_98 = uVar114;
  uStack_90 = uVar115;
  psStack_88 = &sStack_60;
  uStack_80 = uVar117;
  pcStack_78 = (code *)uVar90;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar76);
  pcStack_1c0 = (code *)0x1411aa;
  secp256k1_scalar_verify(r_00);
  uVar114 = psVar76->v[0];
  uVar115 = psVar76->v[1];
  uVar66 = psVar76->v[2];
  uVar90 = r_00->d[0];
  uVar117 = r_00->d[1];
  uVar109 = r_00->d[2];
  uVar103 = r_00->d[3];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar114;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar90;
  uVar78 = SUB168(auVar5 * auVar21,8);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar78;
  uStack_e8 = SUB168(auVar5 * auVar21,0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar114;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar117;
  auVar6 = auVar6 * auVar22;
  uVar95 = SUB168(auVar6 + auVar59,0);
  uVar101 = SUB168(auVar6 + auVar59,8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar115;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar90;
  uVar79 = SUB168(auVar7 * auVar23,8);
  uVar65 = SUB168(auVar7 * auVar23,0);
  uStack_e0 = uVar95 + uVar65;
  uVar65 = (ulong)CARRY8(uVar95,uVar65);
  uVar95 = uVar101 + uVar79;
  uVar102 = uVar95 + uVar65;
  uVar105 = (ulong)CARRY8(auVar6._8_8_,(ulong)CARRY8(uVar78,auVar6._0_8_)) +
            (ulong)(CARRY8(uVar101,uVar79) || CARRY8(uVar95,uVar65));
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar114;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar109;
  uVar80 = SUB168(auVar8 * auVar24,8);
  uVar65 = SUB168(auVar8 * auVar24,0);
  uVar78 = uVar102 + uVar65;
  uVar65 = (ulong)CARRY8(uVar102,uVar65);
  uVar79 = uVar105 + uVar80;
  uVar106 = uVar79 + uVar65;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar115;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar117;
  uVar81 = SUB168(auVar9 * auVar25,8);
  uVar95 = SUB168(auVar9 * auVar25,0);
  uVar102 = uVar78 + uVar95;
  uVar95 = (ulong)CARRY8(uVar78,uVar95);
  uVar101 = uVar106 + uVar81;
  uVar107 = uVar101 + uVar95;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar66;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar90;
  uVar82 = SUB168(auVar10 * auVar26,8);
  uVar78 = SUB168(auVar10 * auVar26,0);
  uStack_d8 = uVar102 + uVar78;
  uVar78 = (ulong)CARRY8(uVar102,uVar78);
  uVar102 = uVar107 + uVar82;
  uVar108 = uVar102 + uVar78;
  uVar107 = (ulong)(CARRY8(uVar105,uVar80) || CARRY8(uVar79,uVar65)) +
            (ulong)(CARRY8(uVar106,uVar81) || CARRY8(uVar101,uVar95)) +
            (ulong)(CARRY8(uVar107,uVar82) || CARRY8(uVar102,uVar78));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar114;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar103;
  uVar81 = SUB168(auVar11 * auVar27,8);
  uVar114 = SUB168(auVar11 * auVar27,0);
  uVar78 = uVar108 + uVar114;
  uVar65 = (ulong)CARRY8(uVar108,uVar114);
  uVar79 = uVar107 + uVar81;
  uVar108 = uVar79 + uVar65;
  uVar114 = psVar76->v[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar115;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar109;
  uVar82 = SUB168(auVar12 * auVar28,8);
  uVar95 = SUB168(auVar12 * auVar28,0);
  uVar102 = uVar78 + uVar95;
  uVar95 = (ulong)CARRY8(uVar78,uVar95);
  uVar101 = uVar108 + uVar82;
  uVar96 = uVar101 + uVar95;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar66;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar117;
  uVar105 = SUB168(auVar13 * auVar29,8);
  uVar78 = SUB168(auVar13 * auVar29,0);
  uVar80 = uVar102 + uVar78;
  uVar78 = (ulong)CARRY8(uVar102,uVar78);
  uVar102 = uVar96 + uVar105;
  uVar97 = uVar102 + uVar78;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar114;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar90;
  uVar106 = SUB168(auVar14 * auVar30,8);
  uVar90 = SUB168(auVar14 * auVar30,0);
  uStack_d0 = uVar80 + uVar90;
  uVar90 = (ulong)CARRY8(uVar80,uVar90);
  uVar80 = uVar97 + uVar106;
  uVar98 = uVar80 + uVar90;
  uVar81 = (ulong)(CARRY8(uVar107,uVar81) || CARRY8(uVar79,uVar65)) +
           (ulong)(CARRY8(uVar108,uVar82) || CARRY8(uVar101,uVar95)) +
           (ulong)(CARRY8(uVar96,uVar105) || CARRY8(uVar102,uVar78)) +
           (ulong)(CARRY8(uVar97,uVar106) || CARRY8(uVar80,uVar90));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar115;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar103;
  uVar101 = SUB168(auVar15 * auVar31,8);
  uVar90 = SUB168(auVar15 * auVar31,0);
  uVar78 = uVar98 + uVar90;
  uVar90 = (ulong)CARRY8(uVar98,uVar90);
  uVar95 = uVar81 + uVar101;
  uVar82 = uVar95 + uVar90;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar66;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar109;
  uVar102 = SUB168(auVar16 * auVar32,8);
  uVar65 = SUB168(auVar16 * auVar32,0);
  uVar79 = uVar78 + uVar65;
  uVar65 = (ulong)CARRY8(uVar78,uVar65);
  uVar78 = uVar82 + uVar102;
  uVar105 = uVar78 + uVar65;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar114;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar117;
  uVar80 = SUB168(auVar17 * auVar33,8);
  uVar117 = SUB168(auVar17 * auVar33,0);
  uStack_c8 = uVar79 + uVar117;
  uVar117 = (ulong)CARRY8(uVar79,uVar117);
  uVar79 = uVar105 + uVar80;
  uVar106 = uVar79 + uVar117;
  uVar79 = (ulong)(CARRY8(uVar81,uVar101) || CARRY8(uVar95,uVar90)) +
           (ulong)(CARRY8(uVar82,uVar102) || CARRY8(uVar78,uVar65)) +
           (ulong)(CARRY8(uVar105,uVar80) || CARRY8(uVar79,uVar117));
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar66;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar103;
  uVar65 = SUB168(auVar18 * auVar34,8);
  uVar66 = SUB168(auVar18 * auVar34,0);
  uVar78 = uVar106 + uVar66;
  uVar66 = (ulong)CARRY8(uVar106,uVar66);
  uVar117 = uVar79 + uVar65;
  uVar101 = uVar117 + uVar66;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar114;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar109;
  uVar95 = SUB168(auVar19 * auVar35,8);
  uVar90 = SUB168(auVar19 * auVar35,0);
  uStack_c0 = uVar78 + uVar90;
  uVar90 = (ulong)CARRY8(uVar78,uVar90);
  uVar109 = uVar101 + uVar95;
  auVar53._8_8_ =
       (ulong)(CARRY8(uVar79,uVar65) || CARRY8(uVar117,uVar66)) +
       (ulong)(CARRY8(uVar101,uVar95) || CARRY8(uVar109,uVar90));
  auVar53._0_8_ = uVar109 + uVar90;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar114;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar103;
  auStack_b8 = auVar20 * auVar36 + auVar53;
  uVar62 = auStack_b8._8_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uStack_e8;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uStack_c8;
  auVar54 = ZEXT816(0x402da1732fc9bebf) * auVar37 + auVar54;
  uStack_158 = auVar54._0_8_;
  uVar66 = auVar54._8_8_;
  uVar117 = uVar66 + uStack_e0;
  uVar66 = (ulong)CARRY8(uVar66,uStack_e0);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uStack_c0;
  uVar65 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,8);
  uVar90 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,0);
  uVar103 = uVar117 + uVar90;
  uVar90 = (ulong)CARRY8(uVar117,uVar90);
  uVar109 = uVar66 + uVar65;
  uVar78 = uVar109 + uVar90;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uStack_c8;
  uVar95 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,8);
  uVar117 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,0);
  uStack_160 = uVar103 + uVar117;
  uVar117 = (ulong)CARRY8(uVar103,uVar117);
  uVar103 = uVar78 + uVar95;
  uVar101 = uVar103 + uVar117;
  uVar79 = (ulong)(CARRY8(uVar66,uVar65) || CARRY8(uVar109,uVar90)) +
           (ulong)(CARRY8(uVar78,uVar95) || CARRY8(uVar103,uVar117));
  uVar117 = uVar101 + uStack_d8;
  uVar66 = (ulong)CARRY8(uVar101,uStack_d8);
  uVar101 = uVar79 + uVar66;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = auStack_b8._0_8_;
  uVar95 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar40,8);
  uVar90 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar40,0);
  uVar109 = uVar117 + uVar90;
  uVar90 = (ulong)CARRY8(uVar117,uVar90);
  uVar103 = uVar101 + uVar95;
  uVar102 = uVar103 + uVar90;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uStack_c0;
  uVar78 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar41,8);
  uVar117 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar41,0);
  uVar81 = uVar109 + uVar117;
  uVar117 = (ulong)CARRY8(uVar109,uVar117);
  uVar65 = uVar102 + uVar78;
  uVar80 = uVar65 + uVar117;
  uStack_168 = uVar81 + uStack_c8;
  uVar109 = (ulong)CARRY8(uVar81,uStack_c8);
  uVar81 = uVar80 + uVar109;
  uVar101 = (ulong)CARRY8(uVar79,uVar66) + (ulong)(CARRY8(uVar101,uVar95) || CARRY8(uVar103,uVar90))
            + (ulong)(CARRY8(uVar102,uVar78) || CARRY8(uVar65,uVar117)) +
            (ulong)CARRY8(uVar80,uVar109);
  uVar117 = uVar81 + uStack_d0;
  uVar66 = (ulong)CARRY8(uVar81,uStack_d0);
  uVar102 = uVar101 + uVar66;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auStack_b8._8_8_;
  uVar95 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar42,8);
  uVar90 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar42,0);
  uVar109 = uVar117 + uVar90;
  uVar90 = (ulong)CARRY8(uVar117,uVar90);
  uVar103 = uVar102 + uVar95;
  uVar80 = uVar103 + uVar90;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = auStack_b8._0_8_;
  uVar78 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar43,8);
  uVar117 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar43,0);
  uVar79 = uVar109 + uVar117;
  uVar117 = (ulong)CARRY8(uVar109,uVar117);
  uVar65 = uVar80 + uVar78;
  uVar81 = uVar65 + uVar117;
  uStack_170 = uVar79 + uStack_c0;
  uVar109 = (ulong)CARRY8(uVar79,uStack_c0);
  uVar79 = uVar81 + uVar109;
  uVar103 = (ulong)CARRY8(uVar101,uVar66) +
            (ulong)(CARRY8(uVar102,uVar95) || CARRY8(uVar103,uVar90)) +
            (ulong)(CARRY8(uVar80,uVar78) || CARRY8(uVar65,uVar117)) + (ulong)CARRY8(uVar81,uVar109)
  ;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = auStack_b8._8_8_;
  uVar109 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar44,8);
  uVar66 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar44,0);
  uVar90 = uVar79 + uVar66;
  uVar66 = (ulong)CARRY8(uVar79,uVar66);
  uVar117 = uVar103 + uVar109;
  uVar65 = uVar117 + uVar66;
  auVar60._8_8_ = uVar65;
  auVar60._0_8_ = uVar90;
  uStack_178 = SUB168(auStack_b8 + auVar60,0);
  uVar90 = (ulong)CARRY8(uVar90,auStack_b8._0_8_);
  psVar110 = SUB168(auStack_b8 + auVar60,8);
  uVar79 = (ulong)(CARRY8(uVar103,uVar109) || CARRY8(uVar117,uVar66)) + (ulong)CARRY8(uVar65,uVar90)
           + (ulong)CARRY8(uVar65 + uVar90,auStack_b8._8_8_);
  auVar58._8_8_ = uVar79;
  auVar58._0_8_ = psVar110;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uStack_158;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uStack_178;
  auVar55 = ZEXT816(0x402da1732fc9bebf) * auVar45 + auVar55;
  uStack_190 = auVar55._0_8_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uStack_190;
  uVar66 = auVar55._8_8_;
  uVar117 = uVar66 + uStack_160;
  uVar66 = (ulong)CARRY8(uVar66,uStack_160);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = psVar110;
  uVar65 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar46,8);
  uVar90 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar46,0);
  uVar103 = uVar117 + uVar90;
  uVar90 = (ulong)CARRY8(uVar117,uVar90);
  uVar109 = uVar66 + uVar65;
  uVar78 = uVar109 + uVar90;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uStack_178;
  uVar95 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar47,8);
  uVar117 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar47,0);
  uStack_198 = uVar103 + uVar117;
  uVar117 = (ulong)CARRY8(uVar103,uVar117);
  uVar103 = uVar78 + uVar95;
  uVar102 = uVar103 + uVar117;
  uVar101 = (ulong)(CARRY8(uVar66,uVar65) || CARRY8(uVar109,uVar90)) +
            (ulong)(CARRY8(uVar78,uVar95) || CARRY8(uVar103,uVar117));
  uVar117 = uVar102 + uStack_168;
  uVar66 = (ulong)CARRY8(uVar102,uStack_168);
  uVar102 = uVar101 + uVar66;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar79;
  uVar95 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar48,8);
  uVar90 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar48,0);
  uVar109 = uVar117 + uVar90;
  uVar90 = (ulong)CARRY8(uVar117,uVar90);
  uVar103 = uVar102 + uVar95;
  uVar80 = uVar103 + uVar90;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = psVar110;
  uVar78 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar49,8);
  uVar117 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar49,0);
  uVar82 = uVar109 + uVar117;
  uVar117 = (ulong)CARRY8(uVar109,uVar117);
  uVar65 = uVar80 + uVar78;
  uVar81 = uVar65 + uVar117;
  uStack_1a0 = uVar82 + uStack_178;
  uVar109 = (ulong)CARRY8(uVar82,uStack_178);
  uVar82 = uVar81 + uVar109;
  auVar56._8_8_ =
       (ulong)CARRY8(uVar101,uVar66) + (ulong)(CARRY8(uVar102,uVar95) || CARRY8(uVar103,uVar90)) +
       (ulong)(CARRY8(uVar80,uVar78) || CARRY8(uVar65,uVar117)) + (ulong)CARRY8(uVar81,uVar109) +
       (ulong)CARRY8(uVar82,uStack_170);
  auVar56._0_8_ = uVar82 + uStack_170;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar79;
  auVar58 = ZEXT816(0x4551231950b75fc4) * auVar50 + auVar56 + auVar58;
  uStack_1a8 = auVar58._0_8_;
  uStack_1b0 = auVar58._8_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uStack_1b0;
  auVar61 = ZEXT816(0x402da1732fc9bebf) * auVar51 + auVar61;
  uVar66 = auVar61._8_8_;
  (psVar89->x).n[0] = auVar61._0_8_;
  auVar57[8] = CARRY8(uVar66,uStack_198);
  auVar57._0_8_ = uVar66 + uStack_198;
  auVar57._9_7_ = 0;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uStack_1b0;
  auVar57 = ZEXT816(0x4551231950b75fc4) * auVar52 + auVar57;
  uVar66 = auVar57._8_8_;
  (psVar89->x).n[1] = auVar57._0_8_;
  uVar90 = uVar66 + uStack_1b0;
  uVar109 = (ulong)CARRY8(uVar66,uStack_1b0) + (ulong)CARRY8(uVar90,uStack_1a0);
  (psVar89->x).n[2] = uVar90 + uStack_1a0;
  uVar117 = (ulong)CARRY8(uVar109,uStack_1a8);
  (psVar89->x).n[3] = uVar109 + uStack_1a8;
  uVar1 = (psVar89->x).n[3];
  uVar66 = (psVar89->x).n[2];
  uVar90 = (psVar89->x).n[1];
  uVar75 = (uint)((0xfffffffffffffffd < uVar66 && uVar1 == 0xffffffffffffffff) &&
                 0xbaaedce6af48a03a < uVar90);
  uVar91 = 0;
  if (0xbaaedce6af48a03b < uVar90) {
    uVar91 = uVar75;
  }
  psVar88 = (secp256k1_gej *)(psVar89->x).n[0];
  uVar63 = 0;
  if ((secp256k1_gej *)0xbfd25e8cd0364140 < psVar88) {
    uVar63 = uVar75;
  }
  uStack_150._0_4_ = (uint)CARRY8(uVar109,uStack_1a8);
  uVar91 = (uVar63 | uVar91 | (uVar66 == 0xffffffffffffffff && uVar1 == 0xffffffffffffffff)) +
           (uint)uStack_150;
  a_00 = (secp256k1_fe *)(ulong)uVar91;
  uStack_188 = uVar79;
  psStack_180 = psVar110;
  uStack_150 = uVar117;
  uStack_148 = uStack_1b0;
  uStack_140 = uStack_1a8;
  uStack_138 = uStack_1a0;
  uStack_130 = uStack_198;
  uStack_128 = uStack_190;
  uStack_120 = uVar79;
  psStack_118 = psVar110;
  uStack_110 = uStack_178;
  uStack_108 = uStack_170;
  uStack_100 = uStack_168;
  uStack_f8 = uStack_160;
  uStack_f0 = uStack_158;
  if (uVar91 < 2) {
    uVar117 = (ulong)uVar91;
    uVar114 = (ulong)CARRY8(uVar117 * 0x402da1732fc9bebf,(ulong)psVar88);
    uVar115 = uVar117 * 0x4551231950b75fc4 + uVar90;
    (psVar89->x).n[0] = uVar117 * 0x402da1732fc9bebf + (long)psVar88;
    (psVar89->x).n[1] = uVar115 + uVar114;
    uVar114 = (ulong)(CARRY8(uVar117 * 0x4551231950b75fc4,uVar90) || CARRY8(uVar115,uVar114));
    (psVar89->x).n[2] = uVar66 + uVar117 + uVar114;
    (psVar89->x).n[3] = uVar1 + (CARRY8(uVar66,uVar117) || CARRY8(uVar66 + uVar117,uVar114));
    pcStack_1c0 = (code *)0x141715;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar89);
    pcStack_1c0 = (code *)0x14171d;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar89);
    return;
  }
  pcStack_1c0 = secp256k1_gej_eq_x_var;
  secp256k1_scalar_mul_cold_1();
  uStack_1c8 = uVar62;
  psStack_208 = (secp256k1_fe *)0x141748;
  psVar100 = psVar88;
  uStack_1d0 = uVar115;
  pcStack_1c0 = (code *)uVar114;
  secp256k1_fe_verify(a_00);
  psStack_208 = (secp256k1_fe *)0x141750;
  psVar85 = psVar88;
  secp256k1_gej_verify(psVar88);
  if (psVar88->infinity == 0) {
    psStack_208 = (secp256k1_fe *)0x141768;
    secp256k1_fe_sqr(&sStack_200,&psVar88->z);
    psStack_208 = (secp256k1_fe *)0x141776;
    secp256k1_fe_mul(&sStack_200,&sStack_200,a_00);
    psStack_208 = (secp256k1_fe *)0x141781;
    secp256k1_fe_equal(&sStack_200,&psVar88->x);
    return;
  }
  psStack_208 = (secp256k1_fe *)secp256k1_fe_cmp_var;
  secp256k1_gej_eq_x_var_cold_1();
  psStack_220 = (secp256k1_gej *)0x14179f;
  psVar92 = psVar100;
  psStack_210 = psVar88;
  psStack_208 = a_00;
  secp256k1_fe_verify(&psVar85->x);
  psStack_220 = (secp256k1_gej *)0x1417a7;
  psVar88 = psVar100;
  secp256k1_fe_verify(&psVar100->x);
  if ((psVar85->x).normalized == 0) {
    psStack_220 = (secp256k1_gej *)0x1417e9;
    secp256k1_fe_cmp_var_cold_2();
  }
  else if ((psVar100->x).normalized != 0) {
    uVar91 = 4;
    while( true ) {
      uVar114 = (psVar100->x).n[uVar91];
      uVar115 = (psVar85->x).n[uVar91];
      if (uVar115 >= uVar114 && uVar115 != uVar114) {
        return;
      }
      if (uVar115 < uVar114) break;
      bVar120 = uVar91 == 0;
      uVar91 = uVar91 - 1;
      if (bVar120) {
        return;
      }
    }
    return;
  }
  psStack_220 = (secp256k1_gej *)secp256k1_fe_add;
  secp256k1_fe_cmp_var_cold_1();
  psStack_238 = (secp256k1_gej *)0x1417fd;
  psVar104 = psVar92;
  psStack_228 = psVar100;
  psStack_220 = psVar85;
  secp256k1_fe_verify(&psVar88->x);
  psStack_238 = (secp256k1_gej *)0x141805;
  psVar100 = psVar92;
  secp256k1_fe_verify(&psVar92->x);
  iVar64 = (psVar92->x).magnitude + (psVar88->x).magnitude;
  if (iVar64 < 0x21) {
    (psVar88->x).n[0] = (psVar88->x).n[0] + (psVar92->x).n[0];
    puVar70 = (psVar88->x).n + 1;
    *puVar70 = *puVar70 + (psVar92->x).n[1];
    puVar70 = (psVar88->x).n + 2;
    *puVar70 = *puVar70 + (psVar92->x).n[2];
    puVar70 = (psVar88->x).n + 3;
    *puVar70 = *puVar70 + (psVar92->x).n[3];
    puVar70 = (psVar88->x).n + 4;
    *puVar70 = *puVar70 + (psVar92->x).n[4];
    (psVar88->x).magnitude = iVar64;
    (psVar88->x).normalized = 0;
    secp256k1_fe_verify(&psVar88->x);
    return;
  }
  psStack_238 = (secp256k1_gej *)secp256k1_modinv64_var;
  secp256k1_fe_add_cold_1();
  auStack_2b8._16_8_ = 0;
  auStack_2b8._24_8_ = 0;
  auStack_2b8._0_8_ = 0;
  auStack_2b8._8_8_ = 0;
  auStack_2b8._32_8_ = 0;
  auStack_2b8._72_8_ = 0;
  auStack_2b8._80_8_ = 0;
  auStack_2b8._56_8_ = 0;
  auStack_2b8._64_8_ = 0;
  auStack_2b8._48_8_ = 1;
  auStack_338._32_8_ = (psVar104->x).n[4];
  auStack_338._0_8_ = (psVar104->x).n[0];
  auStack_338._8_8_ = (psVar104->x).n[1];
  auStack_338._16_8_ = (psVar104->x).n[2];
  auStack_338._24_8_ = (psVar104->x).n[3];
  auStack_300[3] = (psVar100->x).n[4];
  auStack_338._48_8_ = (psVar100->x).n[0];
  auStack_300[0] = (psVar100->x).n[1];
  auStack_300[1] = (psVar100->x).n[2];
  auStack_300[2] = (psVar100->x).n[3];
  uStack_350 = 0;
  lVar118 = -1;
  uStack_354 = 5;
  apsStack_348[0] = psVar100;
  apsStack_348[1] = psVar104;
  auStack_2b8._88_8_ = psVar88;
  psStack_258 = psVar110;
  uStack_250 = uVar79;
  psStack_248 = psVar92;
  uStack_240 = uVar114;
  psStack_238 = psVar89;
LAB_001418ef:
  psVar100 = (secp256k1_gej *)auStack_338._0_8_;
  psVar104 = apsStack_348[1];
  psVar67 = (secp256k1_gej *)0x0;
  psVar86 = (secp256k1_gej *)0x0;
  psVar99 = (secp256k1_gej *)0x1;
  uVar91 = 0x3e;
  psVar92 = (secp256k1_gej *)0x1;
  puVar111 = (undefined1 *)auStack_338._48_8_;
  psVar85 = (secp256k1_gej *)auStack_338._0_8_;
  while( true ) {
    a_01 = (secp256k1_gej *)(-1L << ((byte)uVar91 & 0x3f) | (ulong)puVar111);
    psVar76 = (secp256k1_modinv64_signed62 *)0x0;
    if (a_01 != (secp256k1_gej *)0x0) {
      for (; ((ulong)a_01 >> (long)psVar76 & 1) == 0;
          psVar76 = (secp256k1_modinv64_signed62 *)((long)psVar76->v + 1)) {
      }
    }
    bVar72 = (byte)psVar76;
    psVar112 = (secp256k1_gej *)((ulong)puVar111 >> (bVar72 & 0x3f));
    psVar92 = (secp256k1_gej *)((long)psVar92 << (bVar72 & 0x3f));
    psVar67 = (secp256k1_gej *)((long)psVar67 << (bVar72 & 0x3f));
    lVar118 = lVar118 - (long)psVar76;
    uVar91 = uVar91 - (int)psVar76;
    if (uVar91 == 0) break;
    if (((ulong)psVar85 & 1) == 0) {
      pcStack_360 = (code *)0x141d6c;
      secp256k1_modinv64_var_cold_8();
LAB_00141d6c:
      pcStack_360 = (code *)0x141d71;
      secp256k1_modinv64_var_cold_7();
LAB_00141d71:
      pcStack_360 = (code *)0x141d76;
      secp256k1_modinv64_var_cold_1();
LAB_00141d76:
      pcStack_360 = (code *)0x141d7b;
      secp256k1_modinv64_var_cold_2();
LAB_00141d7b:
      pcStack_360 = (code *)0x141d80;
      secp256k1_modinv64_var_cold_6();
      psVar112 = psVar85;
      goto LAB_00141d80;
    }
    if (((ulong)psVar112 & 1) == 0) goto LAB_00141d6c;
    a_01 = (secp256k1_gej *)((long)psVar67 * auStack_338._48_8_ + (long)psVar92 * auStack_338._0_8_)
    ;
    psVar76 = (secp256k1_modinv64_signed62 *)(ulong)(0x3e - uVar91);
    bVar72 = (byte)(0x3e - uVar91);
    psVar88 = (secp256k1_gej *)((long)psVar85 << (bVar72 & 0x3f));
    if (a_01 != psVar88) goto LAB_00141d71;
    psVar88 = (secp256k1_gej *)
              ((long)psVar99 * auStack_338._48_8_ + (long)psVar86 * auStack_338._0_8_);
    a_01 = (secp256k1_gej *)((long)psVar112 << (bVar72 & 0x3f));
    if (psVar88 != a_01) goto LAB_00141d76;
    psVar76 = (secp256k1_modinv64_signed62 *)(lVar118 - 0x2ea);
    if (psVar76 < (secp256k1_modinv64_signed62 *)0xfffffffffffffa2d) goto LAB_00141d7b;
    iVar64 = (int)psVar112;
    if (lVar118 < 0) {
      lVar118 = -lVar118;
      uVar75 = (int)lVar118 + 1;
      if ((int)uVar91 <= (int)uVar75) {
        uVar75 = uVar91;
      }
      psVar76 = (secp256k1_modinv64_signed62 *)(ulong)uVar75;
      a_01 = (secp256k1_gej *)(ulong)(uVar75 - 0x3f);
      if (0xffffffc1 < uVar75 - 0x3f) {
        psVar113 = (secp256k1_gej *)-(long)psVar67;
        psVar89 = (secp256k1_gej *)-(long)psVar92;
        psVar94 = (secp256k1_gej *)-(long)psVar85;
        psVar88 = (secp256k1_gej *)
                  ((ulong)(0x3fL << (-(char)uVar75 & 0x3fU)) >> (-(char)uVar75 & 0x3fU));
        uVar75 = (iVar64 * iVar64 + 0x3e) * iVar64 * (int)psVar94 & (uint)psVar88;
        psVar67 = psVar99;
        psVar92 = psVar86;
        psVar110 = psVar113;
        goto LAB_00141a4b;
      }
      goto LAB_00141d8a;
    }
    uVar75 = (int)lVar118 + 1;
    if ((int)uVar91 <= (int)uVar75) {
      uVar75 = uVar91;
    }
    psVar76 = (secp256k1_modinv64_signed62 *)(ulong)uVar75;
    a_01 = (secp256k1_gej *)(ulong)(uVar75 - 0x3f);
    if (uVar75 - 0x3f < 0xffffffc2) goto LAB_00141d85;
    psVar88 = (secp256k1_gej *)((ulong)(0xfL << (-(char)uVar75 & 0x3fU)) >> (-(char)uVar75 & 0x3fU))
    ;
    uVar75 = -(iVar64 * (((int)psVar85 * 2 + 2U & 8) + (int)psVar85)) & (uint)psVar88;
    psVar89 = psVar86;
    psVar113 = psVar99;
    psVar94 = psVar112;
    psVar112 = psVar85;
LAB_00141a4b:
    uVar114 = (ulong)uVar75;
    a_01 = (secp256k1_gej *)(uVar114 * (long)psVar112);
    puVar111 = (undefined1 *)((long)(psVar94->x).n + (long)(a_01->x).n);
    psVar86 = (secp256k1_gej *)((long)(psVar89->x).n + (long)psVar92 * uVar114);
    psVar76 = (secp256k1_modinv64_signed62 *)(uVar114 * (long)psVar67);
    psVar99 = (secp256k1_gej *)((long)psVar76->v + (long)&psVar113->x);
    psVar85 = psVar112;
    if (((ulong)puVar111 & (ulong)psVar88) != 0) {
LAB_00141d80:
      pcStack_360 = (code *)0x141d85;
      secp256k1_modinv64_var_cold_4();
      psVar85 = psVar112;
LAB_00141d85:
      pcStack_360 = (code *)0x141d8a;
      secp256k1_modinv64_var_cold_3();
LAB_00141d8a:
      pcStack_360 = (code *)0x141d8f;
      secp256k1_modinv64_var_cold_5();
      psVar104 = psVar110;
      goto LAB_00141d8f;
    }
  }
  a_01 = (secp256k1_gej *)((long)psVar67 * (long)psVar86);
  psVar76 = SUB168(SEXT816((long)psVar67) * SEXT816((long)psVar86),8);
  sStack_2d8.u = (int64_t)psVar92;
  sStack_2d8.v = (int64_t)psVar67;
  sStack_2d8.q = (int64_t)psVar86;
  sStack_2d8.r = (int64_t)psVar99;
  if ((long)psVar92 * (long)psVar99 - (long)a_01 != 0x4000000000000000 ||
      SUB168(SEXT816((long)psVar92) * SEXT816((long)psVar99),8) - (long)psVar76 !=
      (ulong)((secp256k1_gej *)((long)psVar92 * (long)psVar99) < a_01)) goto LAB_00141dc6;
  pcStack_360 = (code *)0x141ad9;
  secp256k1_modinv64_update_de_62
            ((secp256k1_modinv64_signed62 *)auStack_2b8,
             (secp256k1_modinv64_signed62 *)(auStack_2b8 + 0x30),&sStack_2d8,
             (secp256k1_modinv64_modinfo *)apsStack_348[1]);
  uVar91 = uStack_354;
  psVar100 = (secp256k1_gej *)auStack_338;
  psVar88 = (secp256k1_gej *)(ulong)uStack_354;
  psVar92 = (secp256k1_gej *)(ulong)uStack_354;
  psVar76 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
  pcStack_360 = (code *)0x141af6;
  a_01 = psVar100;
  iVar64 = secp256k1_modinv64_mul_cmp_62
                     ((secp256k1_modinv64_signed62 *)psVar100,uStack_354,
                      (secp256k1_modinv64_signed62 *)psVar104,-1);
  psVar85 = (secp256k1_gej *)(auStack_338 + 0x30);
  if (0 < iVar64) {
    psVar76 = (secp256k1_modinv64_signed62 *)0x1;
    psVar92 = (secp256k1_gej *)(ulong)uVar91;
    pcStack_360 = (code *)0x141b15;
    a_01 = psVar100;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar100,uVar91,
                        (secp256k1_modinv64_signed62 *)psVar104,1);
    if (0 < iVar64) goto LAB_00141d94;
    psVar92 = (secp256k1_gej *)(ulong)uVar91;
    psVar76 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_360 = (code *)0x141b31;
    a_01 = psVar85;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar85,uVar91,
                        (secp256k1_modinv64_signed62 *)psVar104,-1);
    if (iVar64 < 1) goto LAB_00141d99;
    psVar76 = (secp256k1_modinv64_signed62 *)0x1;
    psVar92 = (secp256k1_gej *)(ulong)uVar91;
    pcStack_360 = (code *)0x141b4b;
    a_01 = psVar85;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar85,uVar91,
                        (secp256k1_modinv64_signed62 *)psVar104,1);
    if (-1 < iVar64) goto LAB_00141d9e;
    pcStack_360 = (code *)0x141b68;
    secp256k1_modinv64_update_fg_62_var
              (uVar91,(secp256k1_modinv64_signed62 *)psVar100,(secp256k1_modinv64_signed62 *)psVar85
               ,&sStack_2d8);
    if ((undefined1 *)auStack_338._48_8_ == (undefined1 *)0x0) {
      if (1 < (int)uVar91) {
        uVar114 = 1;
        uVar115 = 0;
        do {
          uVar115 = uVar115 | auStack_300[uVar114 - 1];
          uVar114 = uVar114 + 1;
        } while (uVar91 != uVar114);
        if (uVar115 != 0) goto LAB_00141b98;
      }
      a_01 = (secp256k1_gej *)(auStack_338 + 0x30);
      psVar92 = (secp256k1_gej *)(ulong)uVar91;
      psVar76 = (secp256k1_modinv64_signed62 *)0x0;
      pcStack_360 = (code *)0x141c7e;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)a_01,uVar91,&SECP256K1_SIGNED62_ONE,0);
      if (iVar64 != 0) goto LAB_00141dbc;
      pcStack_360 = (code *)0x141ca0;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)auStack_338,uVar91,&SECP256K1_SIGNED62_ONE,
                          -1);
      psVar100 = apsStack_348[0];
      if (iVar64 != 0) {
        pcStack_360 = (code *)0x141cc1;
        iVar64 = secp256k1_modinv64_mul_cmp_62
                           ((secp256k1_modinv64_signed62 *)auStack_338,uVar91,
                            &SECP256K1_SIGNED62_ONE,1);
        if (iVar64 != 0) {
          psVar92 = (secp256k1_gej *)0x5;
          psVar76 = (secp256k1_modinv64_signed62 *)0x0;
          pcStack_360 = (code *)0x141cdb;
          a_01 = psVar100;
          iVar64 = secp256k1_modinv64_mul_cmp_62
                             ((secp256k1_modinv64_signed62 *)psVar100,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar64 != 0) goto LAB_00141dc1;
          a_01 = (secp256k1_gej *)auStack_2b8;
          psVar92 = (secp256k1_gej *)0x5;
          psVar76 = (secp256k1_modinv64_signed62 *)0x0;
          pcStack_360 = (code *)0x141cfe;
          iVar64 = secp256k1_modinv64_mul_cmp_62
                             ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar64 != 0) goto LAB_00141dc1;
          a_01 = (secp256k1_gej *)auStack_338;
          psVar76 = (secp256k1_modinv64_signed62 *)0x1;
          psVar92 = (secp256k1_gej *)(ulong)uVar91;
          pcStack_360 = (code *)0x141d1a;
          iVar64 = secp256k1_modinv64_mul_cmp_62
                             ((secp256k1_modinv64_signed62 *)a_01,uVar91,
                              (secp256k1_modinv64_signed62 *)psVar104,1);
          if (iVar64 != 0) goto LAB_00141dc1;
        }
      }
      pcStack_360 = (code *)0x141d3d;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)auStack_2b8,
                 (int64_t)apsStack_348[(long)(int)uVar91 + 1],(secp256k1_modinv64_modinfo *)psVar104
                );
      (psVar100->x).n[4] = auStack_2b8._32_8_;
      (psVar100->x).n[2] = auStack_2b8._16_8_;
      (psVar100->x).n[3] = auStack_2b8._24_8_;
      (psVar100->x).n[0] = auStack_2b8._0_8_;
      (psVar100->x).n[1] = auStack_2b8._8_8_;
      return;
    }
LAB_00141b98:
    lVar83 = (long)(int)uVar91;
    psVar110 = apsStack_348[lVar83 + 1];
    psVar76 = (secp256k1_modinv64_signed62 *)auStack_300[lVar83 + -2];
    a_01 = (secp256k1_gej *)((long)psVar110 >> 0x3f ^ (ulong)psVar110 | lVar83 + -2 >> 0x3f);
    psVar92 = (secp256k1_gej *)((long)psVar76 >> 0x3f ^ (ulong)psVar76 | (ulong)a_01);
    if (psVar92 == (secp256k1_gej *)0x0) {
      psVar88 = (secp256k1_gej *)(ulong)(uVar91 - 1);
      apsStack_348[lVar83] = (secp256k1_gej *)((ulong)apsStack_348[lVar83] | (long)psVar110 << 0x3e)
      ;
      psVar76 = (secp256k1_modinv64_signed62 *)((long)psVar76 << 0x3e);
      auStack_300[lVar83 + -3] = auStack_300[lVar83 + -3] | (ulong)psVar76;
    }
    if ((int)uStack_350 == 0xb) goto LAB_00141da3;
    uVar91 = (uint)psVar88;
    psVar76 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_360 = (code *)0x141bfc;
    psVar92 = psVar88;
    a_01 = psVar100;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar100,uVar91,
                        (secp256k1_modinv64_signed62 *)psVar104,-1);
    if (iVar64 < 1) goto LAB_00141da8;
    psVar76 = (secp256k1_modinv64_signed62 *)0x1;
    pcStack_360 = (code *)0x141c16;
    psVar92 = psVar88;
    a_01 = psVar100;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar100,uVar91,
                        (secp256k1_modinv64_signed62 *)psVar104,1);
    if (0 < iVar64) goto LAB_00141dad;
    psVar76 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_360 = (code *)0x141c32;
    psVar92 = psVar88;
    a_01 = psVar85;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar85,uVar91,
                        (secp256k1_modinv64_signed62 *)psVar104,-1);
    if (iVar64 < 1) goto LAB_00141db2;
    psVar76 = (secp256k1_modinv64_signed62 *)0x1;
    pcStack_360 = (code *)0x141c4c;
    psVar92 = psVar88;
    a_01 = psVar85;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar85,uVar91,
                        (secp256k1_modinv64_signed62 *)psVar104,1);
    if (-1 < iVar64) goto LAB_00141db7;
    uStack_350 = (ulong)((int)uStack_350 + 1);
    psVar110 = psVar104;
    uStack_354 = uVar91;
    goto LAB_001418ef;
  }
LAB_00141d8f:
  pcStack_360 = (code *)0x141d94;
  secp256k1_modinv64_var_cold_20();
LAB_00141d94:
  pcStack_360 = (code *)0x141d99;
  secp256k1_modinv64_var_cold_19();
LAB_00141d99:
  pcStack_360 = (code *)0x141d9e;
  secp256k1_modinv64_var_cold_18();
LAB_00141d9e:
  pcStack_360 = (code *)0x141da3;
  secp256k1_modinv64_var_cold_17();
LAB_00141da3:
  pcStack_360 = (code *)0x141da8;
  secp256k1_modinv64_var_cold_14();
LAB_00141da8:
  pcStack_360 = (code *)0x141dad;
  secp256k1_modinv64_var_cold_13();
LAB_00141dad:
  pcStack_360 = (code *)0x141db2;
  secp256k1_modinv64_var_cold_12();
LAB_00141db2:
  pcStack_360 = (code *)0x141db7;
  secp256k1_modinv64_var_cold_11();
LAB_00141db7:
  pcStack_360 = (code *)0x141dbc;
  secp256k1_modinv64_var_cold_10();
LAB_00141dbc:
  pcStack_360 = (code *)0x141dc1;
  secp256k1_modinv64_var_cold_15();
LAB_00141dc1:
  pcStack_360 = (code *)0x141dc6;
  secp256k1_modinv64_var_cold_16();
  psVar110 = psVar104;
LAB_00141dc6:
  pcStack_360 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_9();
  uVar114 = (psVar92->x).n[0];
  if (uVar114 >> 0x3e == 0) {
    uVar115 = (psVar92->x).n[1];
    if (0x3fffffffffffffff < uVar115) goto LAB_00141e55;
    psVar76 = (secp256k1_modinv64_signed62 *)(psVar92->x).n[2];
    if ((secp256k1_modinv64_signed62 *)0x3fffffffffffffff < psVar76) goto LAB_00141e5a;
    uVar66 = (psVar92->x).n[3];
    if (0x3fffffffffffffff < uVar66) goto LAB_00141e5f;
    psVar92 = (secp256k1_gej *)(psVar92->x).n[4];
    if (psVar92 < (secp256k1_gej *)&DAT_00000100) {
      (a_01->x).n[0] = uVar115 << 0x3e | uVar114;
      (a_01->x).n[1] = (long)psVar76 << 0x3c | uVar115 >> 2;
      (a_01->x).n[2] = uVar66 << 0x3a | (ulong)psVar76 >> 4;
      (a_01->x).n[3] = (long)psVar92 << 0x38 | uVar66 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_01);
      return;
    }
  }
  else {
    psStack_368 = (secp256k1_gej *)0x141e55;
    secp256k1_scalar_from_signed62_cold_5();
LAB_00141e55:
    psStack_368 = (secp256k1_gej *)0x141e5a;
    secp256k1_scalar_from_signed62_cold_4();
LAB_00141e5a:
    psStack_368 = (secp256k1_gej *)0x141e5f;
    secp256k1_scalar_from_signed62_cold_3();
LAB_00141e5f:
    psStack_368 = (secp256k1_gej *)0x141e64;
    secp256k1_scalar_from_signed62_cold_2();
  }
  psStack_368 = (secp256k1_gej *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  psStack_368 = psVar89;
  lStack_370 = lVar118;
  psStack_378 = psVar100;
  psStack_380 = psVar85;
  psStack_388 = psVar110;
  psStack_390 = psVar88;
  uVar1 = (a_01->x).n[0];
  uStack_3b0 = (a_01->x).n[1];
  uStack_3b8 = (a_01->x).n[2];
  uStack_3c0 = (a_01->x).n[3];
  uStack_3d0 = (a_01->x).n[4];
  uVar2 = (psVar92->x).n[0];
  psStack_398 = (secp256k1_gej *)(psVar92->x).n[1];
  uVar3 = (psVar92->x).n[2];
  uStack_3f8 = *extraout_RDX;
  psStack_3f0 = (secp256k1_gej *)extraout_RDX[1];
  uStack_408 = extraout_RDX[2];
  psStack_400 = (secp256k1_gej *)extraout_RDX[3];
  uStack_3a0 = (psVar92->x).n[3];
  uStack_3d8 = (psVar92->x).n[4];
  uVar114 = 5;
  psVar88 = (secp256k1_gej *)0xfffffffffffffffe;
  psStack_410 = (secp256k1_modinv64_signed62 *)0x141eff;
  psVar110 = a_01;
  iVar64 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar76,-2);
  psVar89 = psVar92;
  if (iVar64 < 1) {
LAB_001429a4:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429a9;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_001429a9:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429ae;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_001429ae:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429b3;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_001429b3:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429b8;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_001429b8:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429bd;
    secp256k1_modinv64_update_de_62_cold_30();
    psVar119 = psVar76;
LAB_001429bd:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429c2;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_001429c2:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429c7;
    secp256k1_modinv64_update_de_62_cold_1();
    psVar76 = psVar119;
LAB_001429c7:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429cc;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_001429cc:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429d1;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_001429d1:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429d6;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_001429d6:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429db;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_001429db:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429e0;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_001429e0:
    psVar85 = psVar110;
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429e5;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_001429e5:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429ea;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_001429ea:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429ef;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_001429ef:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429f4;
    secp256k1_modinv64_update_de_62_cold_9();
    psVar110 = psVar85;
LAB_001429f4:
    psStack_410 = (secp256k1_modinv64_signed62 *)0x1429f9;
    secp256k1_modinv64_update_de_62_cold_28();
  }
  else {
    psVar88 = (secp256k1_gej *)0x1;
    uVar114 = 5;
    psStack_410 = (secp256k1_modinv64_signed62 *)0x141f21;
    psVar110 = a_01;
    psStack_3c8 = a_01;
    iVar64 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar76,1);
    if (-1 < iVar64) goto LAB_001429a9;
    uVar114 = 5;
    psVar88 = (secp256k1_gej *)0xfffffffffffffffe;
    psStack_410 = (secp256k1_modinv64_signed62 *)0x141f40;
    psVar110 = psVar92;
    iVar64 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)psVar92,5,psVar76,-2);
    if (iVar64 < 1) goto LAB_001429ae;
    psVar88 = (secp256k1_gej *)0x1;
    uVar114 = 5;
    psStack_410 = (secp256k1_modinv64_signed62 *)0x141f5d;
    psVar110 = psVar92;
    iVar64 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)psVar92,5,psVar76,1);
    if (-1 < iVar64) goto LAB_001429b3;
    psVar89 = (secp256k1_gej *)0x3fffffffffffffff;
    psStack_410 = (secp256k1_modinv64_signed62 *)0x141f83;
    psStack_3e0 = psVar92;
    uStack_3a8 = uVar3;
    iVar68 = secp256k1_modinv64_abs(uStack_3f8);
    psStack_410 = (secp256k1_modinv64_signed62 *)0x141f90;
    psVar110 = psStack_3f0;
    iVar69 = secp256k1_modinv64_abs((int64_t)psStack_3f0);
    psVar88 = (secp256k1_gej *)(0x4000000000000000 - iVar69);
    if ((long)psVar88 < iVar68) goto LAB_001429b8;
    psStack_410 = (secp256k1_modinv64_signed62 *)0x141fab;
    iVar68 = secp256k1_modinv64_abs(uStack_408);
    psStack_410 = (secp256k1_modinv64_signed62 *)0x141fb8;
    psVar110 = psStack_400;
    iVar69 = secp256k1_modinv64_abs((int64_t)psStack_400);
    psVar88 = (secp256k1_gej *)(0x4000000000000000 - iVar69);
    psVar119 = psVar76;
    if ((long)psVar88 < iVar68) goto LAB_001429bd;
    uVar114 = uStack_3f8 * uVar1;
    psVar88 = SUB168(SEXT816((long)uStack_3f8) * SEXT816((long)uVar1),8);
    uVar115 = (long)psStack_3f0 * uVar2;
    psVar110 = SUB168(SEXT816((long)psStack_3f0) * SEXT816((long)uVar2),8);
    a_01 = (secp256k1_gej *)0x7fffffffffffffff;
    lVar118 = (0x7fffffffffffffff - (long)psVar110) - (long)psVar88;
    if ((SBORROW8(0x7fffffffffffffff - (long)psVar110,(long)psVar88) !=
        SBORROW8(lVar118,(ulong)(~uVar115 < uVar114))) !=
        (long)(lVar118 - (ulong)(~uVar115 < uVar114)) < 0 && -1 < (long)psVar110) goto LAB_001429f4;
    psVar100 = (secp256k1_gej *)(uVar115 + uVar114);
    psVar110 = (secp256k1_gej *)
               ((long)(psVar88->x).n + (long)(psVar110->x).n + (ulong)CARRY8(uVar115,uVar114));
    uVar66 = uStack_408 * uVar1;
    lVar83 = SUB168(SEXT816((long)uStack_408) * SEXT816((long)uVar1),8);
    uVar90 = (long)psStack_400 * uVar2;
    lVar84 = SUB168(SEXT816((long)psStack_400) * SEXT816((long)uVar2),8);
    uVar115 = (ulong)(-uVar90 - 1 < uVar66);
    lVar118 = (0x7fffffffffffffff - lVar84) - lVar83;
    bVar120 = (SBORROW8(0x7fffffffffffffff - lVar84,lVar83) != SBORROW8(lVar118,uVar115)) !=
              (long)(lVar118 - uVar115) < 0;
    psVar88 = (secp256k1_gej *)CONCAT71((int7)(-uVar90 - 1 >> 8),bVar120 && -1 < lVar84);
    if (!bVar120 || -1 >= lVar84) {
      psVar119 = (secp256k1_modinv64_signed62 *)((long)uStack_3d0 >> 0x3f);
      psVar88 = (secp256k1_gej *)((long)uStack_3d8 >> 0x3f);
      lVar93 = ((ulong)psStack_3f0 & (ulong)psVar88) + (uStack_3f8 & (ulong)psVar119);
      psVar92 = (secp256k1_gej *)(uVar90 + uVar66);
      lVar83 = lVar84 + lVar83 + (ulong)CARRY8(uVar90,uVar66);
      lVar118 = psVar76->v[0];
      uVar115 = psVar76[1].v[0];
      uVar114 = lVar93 - (uVar115 * (long)psVar100 + lVar93 & 0x3fffffffffffffff);
      puVar70 = (uint64_t *)(uVar114 * lVar118);
      psVar85 = SUB168(SEXT816((long)uVar114) * SEXT816(lVar118),8);
      psStack_3e8 = psVar76;
      if (-1 < (long)psVar85) {
        uVar66 = (ulong)((secp256k1_gej *)(-(long)puVar70 - 1U) < psVar100);
        lVar84 = (0x7fffffffffffffff - (long)psVar85) - (long)psVar110;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar85,(long)psVar110) != SBORROW8(lVar84,uVar66))
            == (long)(lVar84 - uVar66) < 0) goto LAB_001420e6;
LAB_001422a7:
        psStack_410 = (secp256k1_modinv64_signed62 *)0x1422ac;
        secp256k1_modinv64_update_de_62_cold_26();
LAB_001422ac:
        lVar93 = (-0x8000000000000000 - lVar118) - (ulong)(uVar115 != 0);
        lVar84 = lVar83 - lVar93;
        if ((SBORROW8(lVar83,lVar93) !=
            SBORROW8(lVar84,(ulong)(psVar92 < (secp256k1_gej *)-uVar115))) ==
            (long)(lVar84 - (ulong)(psVar92 < (secp256k1_gej *)-uVar115)) < 0) goto LAB_00142136;
LAB_001422ce:
        psStack_410 = (secp256k1_modinv64_signed62 *)0x1422d3;
        secp256k1_modinv64_update_de_62_cold_25();
        uVar66 = extraout_RAX;
        lVar83 = extraout_RDX_00;
LAB_001422d3:
        psVar104 = (secp256k1_gej *)((-0x8000000000000000 - lVar83) - (ulong)(uVar66 != 0));
        psVar110 = (secp256k1_gej *)
                   (((long)psVar100 - (long)psVar104) - (ulong)(psVar92 < (secp256k1_gej *)-uVar66))
        ;
        if ((SBORROW8((long)psVar100,(long)psVar104) !=
            SBORROW8((long)psVar100 - (long)psVar104,(ulong)(psVar92 < (secp256k1_gej *)-uVar66)))
            == (long)psVar110 < 0) {
LAB_001421b9:
          uVar115 = uVar115 >> 0x3e | lVar118 << 2;
          bVar120 = CARRY8((ulong)psVar92,uVar66);
          psVar92 = (secp256k1_gej *)((long)(psVar92->x).n + uVar66);
          psVar100 = (secp256k1_gej *)((long)(psVar100->x).n + (ulong)bVar120 + lVar83);
          psVar104 = (secp256k1_gej *)(uStack_408 * uStack_3b0 + uVar115);
          psVar110 = (secp256k1_gej *)
                     (SUB168(SEXT816((long)uStack_408) * SEXT816((long)uStack_3b0),8) +
                      (lVar118 >> 0x3e) + (ulong)CARRY8(uStack_408 * uStack_3b0,uVar115));
          uVar115 = (long)psStack_400 * (long)psVar85;
          lVar118 = SUB168(SEXT816((long)psStack_400) * SEXT816((long)psVar85),8);
          if (lVar118 < 0) goto LAB_001422fd;
          uVar66 = (ulong)((secp256k1_gej *)(-1 - uVar115) < psVar104);
          lVar83 = (0x7fffffffffffffff - lVar118) - (long)psVar110;
          psVar76 = (secp256k1_modinv64_signed62 *)(lVar83 - uVar66);
          if ((SBORROW8(0x7fffffffffffffff - lVar118,(long)psVar110) != SBORROW8(lVar83,uVar66)) !=
              (long)psVar76 < 0) goto LAB_00142315;
        }
        else {
LAB_001422f8:
          psStack_410 = (secp256k1_modinv64_signed62 *)0x1422fd;
          secp256k1_modinv64_update_de_62_cold_24();
          uVar115 = extraout_RAX_00;
          lVar118 = extraout_RDX_01;
LAB_001422fd:
          psVar76 = (secp256k1_modinv64_signed62 *)
                    ((-0x8000000000000000 - lVar118) - (ulong)(uVar115 != 0));
          if ((SBORROW8((long)psVar110,(long)psVar76) !=
              SBORROW8((long)psVar110 - (long)psVar76,(ulong)(psVar104 < (secp256k1_gej *)-uVar115))
              ) != (long)(((long)psVar110 - (long)psVar76) -
                         (ulong)(psVar104 < (secp256k1_gej *)-uVar115)) < 0) {
LAB_00142315:
            psStack_410 = (secp256k1_modinv64_signed62 *)0x14231a;
            secp256k1_modinv64_update_de_62_cold_23();
            goto LAB_00142320;
          }
        }
        bVar120 = CARRY8((ulong)psVar104,uVar115);
        psVar104 = (secp256k1_gej *)((long)(psVar104->x).n + uVar115);
        psVar110 = (secp256k1_gej *)((long)(psVar110->x).n + (ulong)bVar120 + lVar118);
        psVar67 = (secp256k1_gej *)psStack_3e8->v[1];
        psVar76 = psStack_3e8;
        if (psVar67 == (secp256k1_gej *)0x0) goto LAB_00142320;
        psVar99 = (secp256k1_gej *)((long)psVar67 * uVar114);
        psVar86 = SUB168(SEXT816((long)psVar67) * SEXT816((long)uVar114),8);
        if ((long)psVar86 < 0) goto LAB_001428ba;
        uVar115 = (ulong)((secp256k1_gej *)(-(long)psVar99 - 1U) < psVar92);
        lVar118 = (0x7fffffffffffffff - (long)psVar86) - (long)psVar100;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar86,(long)psVar100) !=
            SBORROW8(lVar118,uVar115)) != (long)(lVar118 - uVar115) < 0) goto LAB_001428dc;
LAB_00142253:
        bVar120 = CARRY8((ulong)psVar99,(ulong)psVar92);
        psVar99 = (secp256k1_gej *)((long)(psVar99->x).n + (long)(psVar92->x).n);
        psVar86 = (secp256k1_gej *)((long)(psVar100->x).n + (long)(psVar86->x).n + (ulong)bVar120);
        uVar115 = (long)psVar67 * (long)psVar88;
        lVar118 = SUB168(SEXT816((long)psVar67) * SEXT816((long)psVar88),8);
        if (lVar118 < 0) goto LAB_001428e1;
        psVar100 = (secp256k1_gej *)(-1 - uVar115);
        lVar83 = ((long)a_01 - lVar118) - (long)psVar110;
        psVar92 = (secp256k1_gej *)(lVar83 - (ulong)(psVar100 < psVar104));
        if ((SBORROW8((long)a_01 - lVar118,(long)psVar110) !=
            SBORROW8(lVar83,(ulong)(psVar100 < psVar104))) != (long)psVar92 < 0) goto LAB_00142903;
LAB_00142284:
        bVar120 = CARRY8((ulong)psVar104,uVar115);
        psVar104 = (secp256k1_gej *)((long)(psVar104->x).n + uVar115);
        psVar110 = (secp256k1_gej *)((long)(psVar110->x).n + (ulong)bVar120 + lVar118);
        psVar100 = psVar86;
        psVar92 = psVar99;
LAB_00142320:
        psVar86 = psStack_3c8;
        uVar115 = (long)psVar100 << 2 | (ulong)psVar92 >> 0x3e;
        psVar85 = (secp256k1_gej *)(uStack_3f8 * uStack_3b8 + uVar115);
        psVar67 = (secp256k1_gej *)
                  (SUB168(SEXT816((long)uStack_3f8) * SEXT816((long)uStack_3b8),8) +
                   ((long)psVar100 >> 0x3e) + (ulong)CARRY8(uStack_3f8 * uStack_3b8,uVar115));
        (psStack_3c8->x).n[0] = (ulong)psVar92 & 0x3fffffffffffffff;
        uVar115 = (long)psStack_3f0 * uStack_3a8;
        lVar118 = SUB168(SEXT816((long)psStack_3f0) * SEXT816((long)uStack_3a8),8);
        (psStack_3e0->x).n[0] = (ulong)psVar104 & 0x3fffffffffffffff;
        if (lVar118 < 0) {
          psVar92 = (secp256k1_gej *)((-0x8000000000000000 - lVar118) - (ulong)(uVar115 != 0));
          psVar100 = (secp256k1_gej *)
                     (((long)psVar67 - (long)psVar92) - (ulong)(psVar85 < (secp256k1_gej *)-uVar115)
                     );
          if ((SBORROW8((long)psVar67,(long)psVar92) !=
              SBORROW8((long)psVar67 - (long)psVar92,(ulong)(psVar85 < (secp256k1_gej *)-uVar115)))
              != (long)psVar100 < 0) goto LAB_0014247e;
LAB_0014238e:
          uVar66 = (ulong)psVar104 >> 0x3e | (long)psVar110 << 2;
          bVar120 = CARRY8((ulong)psVar85,uVar115);
          psVar85 = (secp256k1_gej *)((long)(psVar85->x).n + uVar115);
          psVar67 = (secp256k1_gej *)((long)(psVar67->x).n + (ulong)bVar120 + lVar118);
          psVar92 = (secp256k1_gej *)(uStack_408 * uStack_3b8 + uVar66);
          psVar100 = (secp256k1_gej *)
                     (SUB168(SEXT816((long)uStack_408) * SEXT816((long)uStack_3b8),8) +
                      ((long)psVar110 >> 0x3e) + (ulong)CARRY8(uStack_408 * uStack_3b8,uVar66));
          uVar115 = (long)psStack_400 * uStack_3a8;
          lVar118 = SUB168(SEXT816((long)psStack_400) * SEXT816((long)uStack_3a8),8);
          if (lVar118 < 0) goto LAB_00142483;
          uVar66 = (ulong)((secp256k1_gej *)(-1 - uVar115) < psVar92);
          lVar83 = ((long)a_01 - lVar118) - (long)psVar100;
          if ((SBORROW8((long)a_01 - lVar118,(long)psVar100) != SBORROW8(lVar83,uVar66)) !=
              (long)(lVar83 - uVar66) < 0) goto LAB_001424a5;
        }
        else {
          psVar100 = (secp256k1_gej *)(-1 - uVar115);
          lVar83 = ((long)a_01 - lVar118) - (long)psVar67;
          psVar92 = (secp256k1_gej *)(lVar83 - (ulong)(psVar100 < psVar85));
          if ((SBORROW8((long)a_01 - lVar118,(long)psVar67) !=
              SBORROW8(lVar83,(ulong)(psVar100 < psVar85))) == (long)psVar92 < 0) goto LAB_0014238e;
LAB_0014247e:
          psStack_410 = (secp256k1_modinv64_signed62 *)0x142483;
          secp256k1_modinv64_update_de_62_cold_22();
          uVar115 = extraout_RAX_01;
          lVar118 = extraout_RDX_02;
LAB_00142483:
          lVar84 = (-0x8000000000000000 - lVar118) - (ulong)(uVar115 != 0);
          lVar83 = (long)psVar100 - lVar84;
          if ((SBORROW8((long)psVar100,lVar84) !=
              SBORROW8(lVar83,(ulong)(psVar92 < (secp256k1_gej *)-uVar115))) !=
              (long)(lVar83 - (ulong)(psVar92 < (secp256k1_gej *)-uVar115)) < 0) {
LAB_001424a5:
            psStack_410 = (secp256k1_modinv64_signed62 *)0x1424aa;
            secp256k1_modinv64_update_de_62_cold_21();
            goto LAB_001424b0;
          }
        }
        bVar120 = CARRY8((ulong)psVar92,uVar115);
        psVar92 = (secp256k1_gej *)((long)(psVar92->x).n + uVar115);
        psVar100 = (secp256k1_gej *)((long)(psVar100->x).n + (ulong)bVar120 + lVar118);
        psVar99 = (secp256k1_gej *)psVar76->v[2];
        if (psVar99 == (secp256k1_gej *)0x0) goto LAB_001424b0;
        psVar110 = (secp256k1_gej *)((long)psVar99 * uVar114);
        psVar104 = SUB168(SEXT816((long)psVar99) * SEXT816((long)uVar114),8);
        if ((long)psVar104 < 0) goto LAB_00142908;
        uVar115 = (ulong)((secp256k1_gej *)(-(long)psVar110 - 1U) < psVar85);
        lVar118 = ((long)a_01 - (long)psVar104) - (long)psVar67;
        psVar112 = psVar85;
        if ((SBORROW8((long)a_01 - (long)psVar104,(long)psVar67) != SBORROW8(lVar118,uVar115)) !=
            (long)(lVar118 - uVar115) < 0) goto LAB_0014292a;
LAB_00142423:
        bVar120 = CARRY8((ulong)psVar110,(ulong)psVar112);
        psVar110 = (secp256k1_gej *)((long)(psVar110->x).n + (long)(psVar112->x).n);
        psVar104 = (secp256k1_gej *)((long)(psVar67->x).n + (long)(psVar104->x).n + (ulong)bVar120);
        uVar115 = (long)psVar99 * (long)psVar88;
        lVar118 = SUB168(SEXT816((long)psVar99) * SEXT816((long)psVar88),8);
        if (lVar118 < 0) goto LAB_0014292f;
        psVar113 = (secp256k1_gej *)(-1 - uVar115);
        lVar83 = ((long)a_01 - lVar118) - (long)psVar100;
        psVar76 = (secp256k1_modinv64_signed62 *)(lVar83 - (ulong)(psVar113 < psVar92));
        psVar85 = psVar110;
        psVar67 = psVar104;
        if ((SBORROW8((long)a_01 - lVar118,(long)psVar100) !=
            SBORROW8(lVar83,(ulong)(psVar113 < psVar92))) != (long)psVar76 < 0) goto LAB_00142951;
LAB_00142454:
        bVar120 = CARRY8((ulong)psVar92,uVar115);
        psVar92 = (secp256k1_gej *)((long)(psVar92->x).n + uVar115);
        psVar100 = (secp256k1_gej *)((long)(psVar100->x).n + (ulong)bVar120 + lVar118);
LAB_001424b0:
        uVar115 = (long)psVar67 << 2 | (ulong)psVar85 >> 0x3e;
        psVar112 = (secp256k1_gej *)(uStack_3f8 * uStack_3c0 + uVar115);
        psVar113 = (secp256k1_gej *)
                   (SUB168(SEXT816((long)uStack_3f8) * SEXT816((long)uStack_3c0),8) +
                    ((long)psVar67 >> 0x3e) + (ulong)CARRY8(uStack_3f8 * uStack_3c0,uVar115));
        (psVar86->x).n[1] = (ulong)psVar85 & 0x3fffffffffffffff;
        uVar115 = (long)psStack_3f0 * uStack_3a0;
        lVar118 = SUB168(SEXT816((long)psStack_3f0) * SEXT816((long)uStack_3a0),8);
        (psStack_3e0->x).n[1] = (ulong)psVar92 & 0x3fffffffffffffff;
        if (lVar118 < 0) {
          uVar66 = (-0x8000000000000000 - lVar118) - (ulong)(uVar115 != 0);
          psVar110 = (secp256k1_gej *)
                     (((long)psVar113 - uVar66) - (ulong)(psVar112 < (secp256k1_gej *)-uVar115));
          if ((SBORROW8((long)psVar113,uVar66) !=
              SBORROW8((long)psVar113 - uVar66,(ulong)(psVar112 < (secp256k1_gej *)-uVar115))) !=
              (long)psVar110 < 0) goto LAB_00142586;
LAB_0014251c:
          uVar90 = (ulong)psVar92 >> 0x3e | (long)psVar100 << 2;
          bVar120 = CARRY8((ulong)psVar112,uVar115);
          psVar112 = (secp256k1_gej *)((long)(psVar112->x).n + uVar115);
          psVar113 = (secp256k1_gej *)((long)(psVar113->x).n + (ulong)bVar120 + lVar118);
          uVar66 = uStack_408 * uStack_3c0 + uVar90;
          psVar110 = (secp256k1_gej *)
                     (SUB168(SEXT816((long)uStack_408) * SEXT816((long)uStack_3c0),8) +
                      ((long)psVar100 >> 0x3e) + (ulong)CARRY8(uStack_408 * uStack_3c0,uVar90));
          uVar115 = (long)psStack_400 * uStack_3a0;
          lVar118 = SUB168(SEXT816((long)psStack_400) * SEXT816((long)uStack_3a0),8);
          if (lVar118 < 0) goto LAB_0014258b;
          uVar90 = (ulong)(-uVar115 - 1 < uVar66);
          lVar83 = ((long)a_01 - lVar118) - (long)psVar110;
          bVar120 = SBORROW8((long)a_01 - lVar118,(long)psVar110) != SBORROW8(lVar83,uVar90);
          lVar83 = lVar83 - uVar90;
        }
        else {
          psVar110 = (secp256k1_gej *)(-1 - uVar115);
          lVar83 = ((long)a_01 - lVar118) - (long)psVar113;
          uVar66 = lVar83 - (ulong)(psVar110 < psVar112);
          if ((SBORROW8((long)a_01 - lVar118,(long)psVar113) !=
              SBORROW8(lVar83,(ulong)(psVar110 < psVar112))) == (long)uVar66 < 0) goto LAB_0014251c;
LAB_00142586:
          psStack_410 = (secp256k1_modinv64_signed62 *)0x14258b;
          secp256k1_modinv64_update_de_62_cold_20();
          uVar115 = extraout_RAX_02;
          lVar118 = extraout_RDX_03;
LAB_0014258b:
          lVar84 = (-0x8000000000000000 - lVar118) - (ulong)(uVar115 != 0);
          lVar83 = (long)psVar110 - lVar84;
          bVar120 = SBORROW8((long)psVar110,lVar84) != SBORROW8(lVar83,(ulong)(uVar66 < -uVar115));
          lVar83 = lVar83 - (ulong)(uVar66 < -uVar115);
        }
        psVar76 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        if (bVar120 != lVar83 < 0) goto LAB_001429cc;
        psVar104 = (secp256k1_gej *)(uVar66 + uVar115);
        psVar110 = (secp256k1_gej *)
                   ((long)(psVar110->x).n + (ulong)CARRY8(uVar66,uVar115) + lVar118);
        psVar100 = (secp256k1_gej *)psStack_3e8->v[3];
        if (psVar100 == (secp256k1_gej *)0x0) goto LAB_0014262a;
        psVar99 = (secp256k1_gej *)((long)psVar100 * uVar114);
        psVar86 = SUB168(SEXT816((long)psVar100) * SEXT816((long)uVar114),8);
        if ((long)psVar86 < 0) goto LAB_00142956;
        uVar115 = (ulong)((secp256k1_gej *)(-(long)psVar99 - 1U) < psVar112);
        lVar118 = ((long)a_01 - (long)psVar86) - (long)psVar113;
        if ((SBORROW8((long)a_01 - (long)psVar86,(long)psVar113) != SBORROW8(lVar118,uVar115)) !=
            (long)(lVar118 - uVar115) < 0) goto LAB_00142978;
LAB_001425eb:
        bVar120 = CARRY8((ulong)psVar99,(ulong)psVar112);
        psVar99 = (secp256k1_gej *)((long)(psVar99->x).n + (long)(psVar112->x).n);
        psVar86 = (secp256k1_gej *)((long)(psVar113->x).n + (long)(psVar86->x).n + (ulong)bVar120);
        uVar115 = (long)psVar100 * (long)psVar88;
        lVar118 = SUB168(SEXT816((long)psVar100) * SEXT816((long)psVar88),8);
        if (lVar118 < 0) goto LAB_0014297d;
        uVar66 = (ulong)((secp256k1_gej *)(-1 - uVar115) < psVar104);
        lVar83 = ((long)a_01 - lVar118) - (long)psVar110;
        psVar113 = psVar86;
        psVar112 = psVar99;
        if ((SBORROW8((long)a_01 - lVar118,(long)psVar110) != SBORROW8(lVar83,uVar66)) ==
            (long)(lVar83 - uVar66) < 0) {
          do {
            bVar120 = CARRY8((ulong)psVar104,uVar115);
            psVar104 = (secp256k1_gej *)((long)(psVar104->x).n + uVar115);
            psVar110 = (secp256k1_gej *)((long)(psVar110->x).n + (ulong)bVar120 + lVar118);
LAB_0014262a:
            psVar85 = psStack_3c8;
            uVar115 = (long)psVar113 << 2 | (ulong)psVar112 >> 0x3e;
            psVar112 = (secp256k1_gej *)((ulong)psVar112 & 0x3fffffffffffffff);
            psVar92 = (secp256k1_gej *)(uStack_3f8 * uStack_3d0 + uVar115);
            psVar100 = (secp256k1_gej *)
                       (SUB168(SEXT816((long)uStack_3f8) * SEXT816((long)uStack_3d0),8) +
                        ((long)psVar113 >> 0x3e) + (ulong)CARRY8(uStack_3f8 * uStack_3d0,uVar115));
            (psStack_3c8->x).n[2] = (uint64_t)psVar112;
            uVar115 = (long)psStack_3f0 * uStack_3d8;
            lVar118 = SUB168(SEXT816((long)psStack_3f0) * SEXT816((long)uStack_3d8),8);
            (psStack_3e0->x).n[2] = (ulong)psVar104 & 0x3fffffffffffffff;
            if (lVar118 < 0) {
              lVar84 = (-0x8000000000000000 - lVar118) - (ulong)(uVar115 != 0);
              lVar83 = (long)psVar100 - lVar84;
              psVar67 = (secp256k1_gej *)(lVar83 - (ulong)(psVar92 < (secp256k1_gej *)-uVar115));
              if ((SBORROW8((long)psVar100,lVar84) !=
                  SBORROW8(lVar83,(ulong)(psVar92 < (secp256k1_gej *)-uVar115))) !=
                  (long)psVar67 < 0) goto LAB_00142704;
LAB_00142698:
              uVar66 = (ulong)psVar104 >> 0x3e | (long)psVar110 << 2;
              bVar120 = CARRY8((ulong)psVar92,uVar115);
              psVar92 = (secp256k1_gej *)((long)(psVar92->x).n + uVar115);
              psVar100 = (secp256k1_gej *)((long)(psVar100->x).n + (ulong)bVar120 + lVar118);
              psVar112 = (secp256k1_gej *)(uStack_408 * uStack_3d0 + uVar66);
              psVar67 = (secp256k1_gej *)
                        (SUB168(SEXT816((long)uStack_408) * SEXT816((long)uStack_3d0),8) +
                         ((long)psVar110 >> 0x3e) + (ulong)CARRY8(uStack_408 * uStack_3d0,uVar66));
              uVar115 = (long)psStack_400 * uStack_3d8;
              lVar118 = SUB168(SEXT816((long)psStack_400) * SEXT816((long)uStack_3d8),8);
              if (lVar118 < 0) goto LAB_00142709;
              psVar110 = (secp256k1_gej *)(-1 - uVar115);
              lVar83 = ((long)a_01 - lVar118) - (long)psVar67;
              bVar120 = SBORROW8((long)a_01 - lVar118,(long)psVar67) !=
                        SBORROW8(lVar83,(ulong)(psVar110 < psVar112));
              psVar104 = (secp256k1_gej *)(lVar83 - (ulong)(psVar110 < psVar112));
            }
            else {
              psVar67 = (secp256k1_gej *)(-1 - uVar115);
              lVar83 = ((long)a_01 - lVar118) - (long)psVar100;
              if ((SBORROW8((long)a_01 - lVar118,(long)psVar100) !=
                  SBORROW8(lVar83,(ulong)(psVar67 < psVar92))) ==
                  (long)(lVar83 - (ulong)(psVar67 < psVar92)) < 0) goto LAB_00142698;
LAB_00142704:
              psStack_410 = (secp256k1_modinv64_signed62 *)0x142709;
              secp256k1_modinv64_update_de_62_cold_18();
              uVar115 = extraout_RAX_03;
              lVar118 = extraout_RDX_04;
LAB_00142709:
              lVar84 = (-0x8000000000000000 - lVar118) - (ulong)(uVar115 != 0);
              lVar83 = (long)psVar67 - lVar84;
              bVar120 = SBORROW8((long)psVar67,lVar84) !=
                        SBORROW8(lVar83,(ulong)(psVar112 < (secp256k1_gej *)-uVar115));
              psVar110 = (secp256k1_gej *)(lVar83 - (ulong)(psVar112 < (secp256k1_gej *)-uVar115));
              psVar104 = psVar110;
            }
            psVar76 = psStack_3e8;
            psVar86 = (secp256k1_gej *)0x8000000000000000;
            if (bVar120 != (long)psVar104 < 0) goto LAB_001429d1;
            psVar99 = (secp256k1_gej *)((long)(psVar112->x).n + uVar115);
            psVar67 = (secp256k1_gej *)
                      ((long)(psVar67->x).n + (ulong)CARRY8((ulong)psVar112,uVar115) + lVar118);
            psVar104 = (secp256k1_gej *)psStack_3e8->v[4];
            psVar110 = (secp256k1_gej *)((long)psVar104 * uVar114);
            uVar114 = SUB168(SEXT816((long)psVar104) * SEXT816((long)uVar114),8);
            if ((long)uVar114 < 0) {
              lVar83 = (-0x8000000000000000 - uVar114) - (ulong)(psVar110 != (secp256k1_gej *)0x0);
              lVar118 = (long)psVar100 - lVar83;
              if ((SBORROW8((long)psVar100,lVar83) !=
                  SBORROW8(lVar118,(ulong)(psVar92 < (secp256k1_gej *)-(long)psVar110))) !=
                  (long)(lVar118 - (ulong)(psVar92 < (secp256k1_gej *)-(long)psVar110)) < 0)
              goto LAB_00142895;
LAB_00142764:
              bVar120 = CARRY8((ulong)psVar110,(ulong)psVar92);
              psVar110 = (secp256k1_gej *)((long)(psVar110->x).n + (long)(psVar92->x).n);
              uVar114 = (long)(psVar100->x).n + bVar120 + uVar114;
              uVar115 = (long)psVar104 * (long)psVar88;
              lVar118 = SUB168(SEXT816((long)psVar104) * SEXT816((long)psVar88),8);
              if (lVar118 < 0) goto LAB_0014289a;
              psVar88 = (secp256k1_gej *)(-uVar115 - 1);
              lVar83 = (long)a_01 - lVar118;
              lVar84 = lVar83 - (long)psVar67;
              a_01 = (secp256k1_gej *)(lVar84 - (ulong)(psVar88 < psVar99));
              if ((SBORROW8(lVar83,(long)psVar67) != SBORROW8(lVar84,(ulong)(psVar88 < psVar99))) ==
                  (long)a_01 < 0) goto LAB_00142792;
            }
            else {
              uVar115 = (ulong)((secp256k1_gej *)(-(long)psVar110 - 1U) < psVar92);
              lVar118 = ((long)a_01 - uVar114) - (long)psVar100;
              if ((SBORROW8((long)a_01 - uVar114,(long)psVar100) != SBORROW8(lVar118,uVar115)) ==
                  (long)(lVar118 - uVar115) < 0) goto LAB_00142764;
LAB_00142895:
              psStack_410 = (secp256k1_modinv64_signed62 *)0x14289a;
              secp256k1_modinv64_update_de_62_cold_16();
              uVar115 = extraout_RAX_04;
              lVar118 = extraout_RDX_05;
LAB_0014289a:
              psVar100 = (secp256k1_gej *)((-0x8000000000000000 - lVar118) - (ulong)(uVar115 != 0));
              psVar88 = (secp256k1_gej *)
                        (((long)psVar67 - (long)psVar100) -
                        (ulong)(psVar99 < (secp256k1_gej *)-uVar115));
              if ((SBORROW8((long)psVar67,(long)psVar100) !=
                  SBORROW8((long)psVar67 - (long)psVar100,
                           (ulong)(psVar99 < (secp256k1_gej *)-uVar115))) == (long)psVar88 < 0) {
LAB_00142792:
                a_01 = psStack_3e0;
                uVar66 = (long)(psVar99->x).n + uVar115;
                lVar118 = (long)(psVar67->x).n + (ulong)CARRY8(uVar115,(ulong)psVar99) + lVar118;
                psVar88 = (secp256k1_gej *)(uVar114 << 2 | (ulong)psVar110 >> 0x3e);
                (psVar85->x).n[3] = (ulong)psVar110 & 0x3fffffffffffffff;
                psVar89 = (secp256k1_gej *)(uVar66 & 0x3fffffffffffffff);
                (psStack_3e0->x).n[3] = (uint64_t)psVar89;
                psVar110 = (secp256k1_gej *)&psVar88[0xd79435e50d7942].z;
                uVar114 = ((long)uVar114 >> 0x3e) + -1 +
                          (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar88);
                if (uVar114 != 0xffffffffffffffff) goto LAB_001429d6;
                uVar114 = 0xffffffffffffffff;
                uVar115 = uVar66 >> 0x3e | lVar118 * 4;
                (psVar85->x).n[4] = (uint64_t)psVar88;
                if ((lVar118 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar115) != -1)
                goto LAB_001429db;
                (psStack_3e0->x).n[4] = uVar115;
                uVar114 = 5;
                psVar88 = (secp256k1_gej *)0xfffffffffffffffe;
                psStack_410 = (secp256k1_modinv64_signed62 *)0x14280a;
                psVar110 = psVar85;
                iVar64 = secp256k1_modinv64_mul_cmp_62
                                   ((secp256k1_modinv64_signed62 *)psVar85,5,psVar76,-2);
                if (iVar64 < 1) goto LAB_001429e0;
                psVar88 = (secp256k1_gej *)0x1;
                uVar114 = 5;
                psStack_410 = (secp256k1_modinv64_signed62 *)0x142827;
                iVar64 = secp256k1_modinv64_mul_cmp_62
                                   ((secp256k1_modinv64_signed62 *)psVar85,5,psVar76,1);
                if (-1 < iVar64) goto LAB_001429e5;
                uVar114 = 5;
                psVar88 = (secp256k1_gej *)0xfffffffffffffffe;
                psStack_410 = (secp256k1_modinv64_signed62 *)0x142846;
                psVar85 = a_01;
                iVar64 = secp256k1_modinv64_mul_cmp_62
                                   ((secp256k1_modinv64_signed62 *)a_01,5,psVar76,-2);
                if (iVar64 < 1) goto LAB_001429ea;
                psVar88 = (secp256k1_gej *)0x1;
                uVar114 = 5;
                psStack_410 = (secp256k1_modinv64_signed62 *)0x142863;
                psVar85 = a_01;
                iVar64 = secp256k1_modinv64_mul_cmp_62
                                   ((secp256k1_modinv64_signed62 *)a_01,5,psVar76,1);
                if (iVar64 < 0) {
                  return;
                }
                goto LAB_001429ef;
              }
            }
            psStack_410 = (secp256k1_modinv64_signed62 *)0x1428ba;
            secp256k1_modinv64_update_de_62_cold_15();
LAB_001428ba:
            lVar83 = (-0x8000000000000000 - (long)psVar86) -
                     (ulong)(psVar99 != (secp256k1_gej *)0x0);
            lVar118 = (long)psVar100 - lVar83;
            if ((SBORROW8((long)psVar100,lVar83) !=
                SBORROW8(lVar118,(ulong)(psVar92 < (secp256k1_gej *)-(long)psVar99))) ==
                (long)(lVar118 - (ulong)(psVar92 < (secp256k1_gej *)-(long)psVar99)) < 0)
            goto LAB_00142253;
LAB_001428dc:
            psStack_410 = (secp256k1_modinv64_signed62 *)0x1428e1;
            secp256k1_modinv64_update_de_62_cold_4();
            uVar115 = extraout_RAX_05;
            lVar118 = extraout_RDX_06;
LAB_001428e1:
            psVar92 = (secp256k1_gej *)((-0x8000000000000000 - lVar118) - (ulong)(uVar115 != 0));
            psVar100 = (secp256k1_gej *)
                       (((long)psVar110 - (long)psVar92) -
                       (ulong)(psVar104 < (secp256k1_gej *)-uVar115));
            if ((SBORROW8((long)psVar110,(long)psVar92) !=
                SBORROW8((long)psVar110 - (long)psVar92,
                         (ulong)(psVar104 < (secp256k1_gej *)-uVar115))) == (long)psVar100 < 0)
            goto LAB_00142284;
LAB_00142903:
            psStack_410 = (secp256k1_modinv64_signed62 *)0x142908;
            secp256k1_modinv64_update_de_62_cold_3();
LAB_00142908:
            lVar83 = (-0x8000000000000000 - (long)psVar104) -
                     (ulong)(psVar110 != (secp256k1_gej *)0x0);
            lVar118 = (long)psVar67 - lVar83;
            psVar112 = psVar85;
            if ((SBORROW8((long)psVar67,lVar83) !=
                SBORROW8(lVar118,(ulong)(psVar85 < (secp256k1_gej *)-(long)psVar110))) ==
                (long)(lVar118 - (ulong)(psVar85 < (secp256k1_gej *)-(long)psVar110)) < 0)
            goto LAB_00142423;
LAB_0014292a:
            psStack_410 = (secp256k1_modinv64_signed62 *)0x14292f;
            secp256k1_modinv64_update_de_62_cold_6();
            uVar115 = extraout_RAX_06;
            lVar118 = extraout_RDX_07;
            psVar112 = psVar85;
LAB_0014292f:
            psVar76 = (secp256k1_modinv64_signed62 *)
                      ((-0x8000000000000000 - lVar118) - (ulong)(uVar115 != 0));
            psVar113 = (secp256k1_gej *)
                       (((long)psVar100 - (long)psVar76) -
                       (ulong)(psVar92 < (secp256k1_gej *)-uVar115));
            psVar85 = psVar110;
            psVar67 = psVar104;
            if ((SBORROW8((long)psVar100,(long)psVar76) !=
                SBORROW8((long)psVar100 - (long)psVar76,(ulong)(psVar92 < (secp256k1_gej *)-uVar115)
                        )) == (long)psVar113 < 0) goto LAB_00142454;
LAB_00142951:
            psStack_410 = (secp256k1_modinv64_signed62 *)0x142956;
            secp256k1_modinv64_update_de_62_cold_5();
LAB_00142956:
            lVar83 = (-0x8000000000000000 - (long)psVar86) -
                     (ulong)(psVar99 != (secp256k1_gej *)0x0);
            lVar118 = (long)psVar113 - lVar83;
            if ((SBORROW8((long)psVar113,lVar83) !=
                SBORROW8(lVar118,(ulong)(psVar112 < (secp256k1_gej *)-(long)psVar99))) ==
                (long)(lVar118 - (ulong)(psVar112 < (secp256k1_gej *)-(long)psVar99)) < 0)
            goto LAB_001425eb;
LAB_00142978:
            psStack_410 = (secp256k1_modinv64_signed62 *)0x14297d;
            secp256k1_modinv64_update_de_62_cold_8();
            uVar115 = extraout_RAX_07;
            lVar118 = extraout_RDX_08;
LAB_0014297d:
            lVar84 = (-0x8000000000000000 - lVar118) - (ulong)(uVar115 != 0);
            lVar83 = (long)psVar110 - lVar84;
            psVar113 = psVar86;
            psVar112 = psVar99;
            if ((SBORROW8((long)psVar110,lVar84) !=
                SBORROW8(lVar83,(ulong)(psVar104 < (secp256k1_gej *)-uVar115))) !=
                (long)(lVar83 - (ulong)(psVar104 < (secp256k1_gej *)-uVar115)) < 0) break;
          } while( true );
        }
        psStack_410 = (secp256k1_modinv64_signed62 *)0x1429a4;
        secp256k1_modinv64_update_de_62_cold_7();
        goto LAB_001429a4;
      }
      lVar93 = (-0x8000000000000000 - (long)psVar85) - (ulong)(puVar70 != (uint64_t *)0x0);
      lVar84 = (long)psVar110 - lVar93;
      if ((SBORROW8((long)psVar110,lVar93) !=
          SBORROW8(lVar84,(ulong)(psVar100 < (secp256k1_gej *)-(long)puVar70))) !=
          (long)(lVar84 - (ulong)(psVar100 < (secp256k1_gej *)-(long)puVar70)) < 0)
      goto LAB_001422a7;
LAB_001420e6:
      psVar119 = (secp256k1_modinv64_signed62 *)((ulong)psVar119 & uStack_408);
      psVar88 = (secp256k1_gej *)
                ((long)psVar119 +
                (((ulong)psVar88 & (ulong)psStack_400) -
                ((long)psVar119->v + uVar115 * (long)psVar92 + ((ulong)psVar88 & (ulong)psStack_400)
                & 0x3fffffffffffffff)));
      bVar120 = CARRY8((ulong)puVar70,(ulong)psVar100);
      puVar70 = (uint64_t *)((long)(psVar100->x).n + (long)puVar70);
      psVar85 = (secp256k1_gej *)((long)(psVar110->x).n + (long)(psVar85->x).n + (ulong)bVar120);
      uVar115 = (long)psVar88 * lVar118;
      lVar118 = SUB168(SEXT816((long)psVar88) * SEXT816(lVar118),8);
      if (lVar118 < 0) goto LAB_001422ac;
      uVar66 = (ulong)((secp256k1_gej *)(-uVar115 - 1) < psVar92);
      lVar84 = (0x7fffffffffffffff - lVar118) - lVar83;
      if ((SBORROW8(0x7fffffffffffffff - lVar118,lVar83) != SBORROW8(lVar84,uVar66)) !=
          (long)(lVar84 - uVar66) < 0) goto LAB_001422ce;
LAB_00142136:
      bVar120 = CARRY8(uVar115,(ulong)psVar92);
      uVar115 = (long)(psVar92->x).n + uVar115;
      lVar118 = lVar118 + lVar83 + (ulong)bVar120;
      if (((ulong)puVar70 & 0x3fffffffffffffff) != 0) goto LAB_001429c2;
      psVar76 = psVar119;
      if ((uVar115 & 0x3fffffffffffffff) == 0) {
        uVar66 = (ulong)puVar70 >> 0x3e | (long)psVar85 << 2;
        psVar92 = (secp256k1_gej *)(uStack_3f8 * uStack_3b0 + uVar66);
        psVar100 = (secp256k1_gej *)
                   (SUB168(SEXT816((long)uStack_3f8) * SEXT816((long)uStack_3b0),8) +
                    ((long)psVar85 >> 0x3e) + (ulong)CARRY8(uStack_3f8 * uStack_3b0,uVar66));
        uVar66 = (long)psStack_3f0 * (long)psStack_398;
        lVar83 = SUB168(SEXT816((long)psStack_3f0) * SEXT816((long)psStack_398),8);
        psVar85 = psStack_398;
        if (lVar83 < 0) goto LAB_001422d3;
        psVar110 = (secp256k1_gej *)(-1 - uVar66);
        lVar84 = (0x7fffffffffffffff - lVar83) - (long)psVar100;
        psVar104 = (secp256k1_gej *)(lVar84 - (ulong)(psVar110 < psVar92));
        if ((SBORROW8(0x7fffffffffffffff - lVar83,(long)psVar100) !=
            SBORROW8(lVar84,(ulong)(psVar110 < psVar92))) != (long)psVar104 < 0) goto LAB_001422f8;
        goto LAB_001421b9;
      }
      goto LAB_001429c7;
    }
  }
  iVar64 = (int)uVar114;
  psStack_410 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_27();
  psVar119 = &sStack_470;
  psStack_420 = psVar89;
  psStack_418 = a_01;
  psStack_410 = psVar76;
  secp256k1_modinv64_mul_62(&sStack_448,(secp256k1_modinv64_signed62 *)psVar110,iVar64,1);
  psVar76 = a;
  secp256k1_modinv64_mul_62(&sStack_470,a,5,(int64_t)psVar88);
  lVar118 = 0;
  while ((ulong)sStack_448.v[lVar118] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_470.v[lVar118]) goto LAB_00142a8e;
    lVar118 = lVar118 + 1;
    if (lVar118 == 4) {
      uVar91 = 4;
      while( true ) {
        if (sStack_448.v[uVar91] < sStack_470.v[uVar91]) {
          return;
        }
        if (sStack_470.v[uVar91] < sStack_448.v[uVar91]) break;
        bVar120 = uVar91 == 0;
        uVar91 = uVar91 - 1;
        if (bVar120) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00142a8e:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar64 = (int)psVar119;
  if (iVar64 < 1) {
LAB_00142d3b:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00142d40:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00142d45:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00142d4a:
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_00142d4f:
    secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00142d54:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    uVar1 = (psVar88->x).n[0];
    uVar2 = (psVar88->x).n[1];
    lVar118 = psVar76->v[0];
    lVar83 = *extraout_RDX_09;
    uVar114 = lVar118 * uVar1;
    lVar93 = SUB168(SEXT816(lVar118) * SEXT816((long)uVar1),8);
    uVar115 = lVar83 * uVar2;
    lVar87 = SUB168(SEXT816(lVar83) * SEXT816((long)uVar2),8);
    lVar84 = (0x7fffffffffffffff - lVar87) - lVar93;
    if ((SBORROW8(0x7fffffffffffffff - lVar87,lVar93) !=
        SBORROW8(lVar84,(ulong)(~uVar115 < uVar114))) !=
        (long)(lVar84 - (ulong)(~uVar115 < uVar114)) < 0 && -1 < lVar87) goto LAB_00142d54;
    uVar3 = (psVar88->x).n[2];
    uVar4 = (psVar88->x).n[3];
    lVar93 = lVar87 + lVar93 + (ulong)CARRY8(uVar115,uVar114);
    uVar90 = lVar118 * uVar3;
    lVar84 = SUB168(SEXT816(lVar118) * SEXT816((long)uVar3),8);
    uVar117 = lVar83 * uVar4;
    lVar83 = SUB168(SEXT816(lVar83) * SEXT816((long)uVar4),8);
    uVar66 = (ulong)(-uVar117 - 1 < uVar90);
    lVar118 = (0x7fffffffffffffff - lVar83) - lVar84;
    if ((SBORROW8(0x7fffffffffffffff - lVar83,lVar84) != SBORROW8(lVar118,uVar66)) ==
        (long)(lVar118 - uVar66) < 0 || lVar83 < 0) {
      lVar118 = lVar83 + lVar84 + (ulong)CARRY8(uVar117,uVar90);
      if ((uVar115 + uVar114 & 0x3fffffffffffffff) != 0) goto LAB_00142d40;
      if ((uVar117 + uVar90 & 0x3fffffffffffffff) != 0) goto LAB_00142d45;
      uVar66 = uVar117 + uVar90 >> 0x3e | lVar118 * 4;
      uVar114 = uVar115 + uVar114 >> 0x3e | lVar93 * 4;
      lVar118 = lVar118 >> 0x3e;
      lVar93 = lVar93 >> 0x3e;
      if (iVar64 != 1) {
        psVar119 = (secp256k1_modinv64_signed62 *)((ulong)psVar119 & 0xffffffff);
        psVar77 = (secp256k1_modinv64_signed62 *)0x1;
        do {
          lVar83 = psVar76->v[(long)psVar77];
          uVar90 = lVar83 * uVar1 + uVar114;
          lVar87 = SUB168(SEXT816(lVar83) * SEXT816((long)uVar1),8) + lVar93 +
                   (ulong)CARRY8(lVar83 * uVar1,uVar114);
          lVar84 = extraout_RDX_09[(long)psVar77];
          uVar115 = lVar84 * uVar2;
          lVar93 = SUB168(SEXT816(lVar84) * SEXT816((long)uVar2),8);
          if (lVar93 < 0) {
            lVar116 = (-0x8000000000000000 - lVar93) - (ulong)(uVar115 != 0);
            lVar71 = lVar87 - lVar116;
            if ((SBORROW8(lVar87,lVar116) != SBORROW8(lVar71,(ulong)(uVar90 < -uVar115))) ==
                (long)(lVar71 - (ulong)(uVar90 < -uVar115)) < 0) goto LAB_00142c2a;
LAB_00142d31:
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00142d36:
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_00142d3b;
          }
          uVar114 = (ulong)(-uVar115 - 1 < uVar90);
          lVar71 = (0x7fffffffffffffff - lVar93) - lVar87;
          if ((SBORROW8(0x7fffffffffffffff - lVar93,lVar87) != SBORROW8(lVar71,uVar114)) !=
              (long)(lVar71 - uVar114) < 0) goto LAB_00142d31;
LAB_00142c2a:
          lVar93 = lVar87 + lVar93 + (ulong)CARRY8(uVar90,uVar115);
          uVar109 = lVar83 * uVar3 + uVar66;
          lVar83 = SUB168(SEXT816(lVar83) * SEXT816((long)uVar3),8) + lVar118 +
                   (ulong)CARRY8(lVar83 * uVar3,uVar66);
          uVar117 = lVar84 * uVar4;
          lVar118 = SUB168(SEXT816(lVar84) * SEXT816((long)uVar4),8);
          if (lVar118 < 0) {
            lVar87 = (-0x8000000000000000 - lVar118) - (ulong)(uVar117 != 0);
            lVar84 = lVar83 - lVar87;
            if ((SBORROW8(lVar83,lVar87) != SBORROW8(lVar84,(ulong)(uVar109 < -uVar117))) !=
                (long)(lVar84 - (ulong)(uVar109 < -uVar117)) < 0) goto LAB_00142d36;
          }
          else {
            uVar114 = (ulong)(-uVar117 - 1 < uVar109);
            lVar84 = (0x7fffffffffffffff - lVar118) - lVar83;
            if ((SBORROW8(0x7fffffffffffffff - lVar118,lVar83) != SBORROW8(lVar84,uVar114)) !=
                (long)(lVar84 - uVar114) < 0) goto LAB_00142d36;
          }
          lVar118 = lVar83 + lVar118 + (ulong)CARRY8(uVar109,uVar117);
          uVar114 = lVar93 * 4 | uVar90 + uVar115 >> 0x3e;
          psVar76->v[(long)((long)psVar77[-1].v + 0x27)] = uVar90 + uVar115 & 0x3fffffffffffffff;
          uVar66 = lVar118 * 4 | uVar109 + uVar117 >> 0x3e;
          extraout_RDX_09[(long)((long)psVar77[-1].v + 0x27)] =
               uVar109 + uVar117 & 0x3fffffffffffffff;
          psVar77 = (secp256k1_modinv64_signed62 *)((long)psVar77->v + 1);
          lVar118 = lVar118 >> 0x3e;
          lVar93 = lVar93 >> 0x3e;
        } while (psVar119 != psVar77);
      }
      if (lVar93 + -1 + (ulong)(0x7fffffffffffffff < uVar114) != -1) goto LAB_00142d4a;
      psVar76->v[(long)iVar64 + -1] = uVar114;
      if (lVar118 + -1 + (ulong)(0x7fffffffffffffff < uVar66) == -1) {
        extraout_RDX_09[(long)iVar64 + -1] = uVar66;
        return;
      }
      goto LAB_00142d4f;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar118 = psVar119->v[0];
  lVar83 = psVar119->v[1];
  lVar84 = psVar119->v[2];
  lVar93 = psVar119->v[3];
  lVar87 = psVar119->v[4];
  lVar71 = 0;
  do {
    if (psVar119->v[lVar71] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_00142f8a:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00142f8f;
    }
    if (0x3fffffffffffffff < psVar119->v[lVar71]) goto LAB_00142f8a;
    lVar71 = lVar71 + 1;
  } while (lVar71 != 5);
  iVar64 = secp256k1_modinv64_mul_cmp_62(psVar119,5,b,-2);
  if (iVar64 < 1) {
LAB_00142f8f:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00142f94:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_00142f99:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar64 = secp256k1_modinv64_mul_cmp_62(psVar119,5,b,1);
    if (-1 < iVar64) goto LAB_00142f94;
    uVar114 = lVar87 >> 0x3f;
    uVar90 = (long)psVar76 >> 0x3f;
    uVar115 = ((uVar114 & b->v[0]) + lVar118 ^ uVar90) - uVar90;
    uVar117 = ((long)uVar115 >> 0x3e) + (((uVar114 & b->v[1]) + lVar83 ^ uVar90) - uVar90);
    uVar109 = ((long)uVar117 >> 0x3e) + ((lVar84 + (uVar114 & b->v[2]) ^ uVar90) - uVar90);
    uVar66 = ((long)uVar109 >> 0x3e) + (((uVar114 & b->v[3]) + lVar93 ^ uVar90) - uVar90);
    lVar118 = ((long)uVar66 >> 0x3e) + (((uVar114 & b->v[4]) + lVar87 ^ uVar90) - uVar90);
    uVar90 = lVar118 >> 0x3f;
    uVar114 = (b->v[0] & uVar90) + (uVar115 & 0x3fffffffffffffff);
    uVar117 = ((long)uVar114 >> 0x3e) + (b->v[1] & uVar90) + (uVar117 & 0x3fffffffffffffff);
    uVar115 = ((long)uVar117 >> 0x3e) + (b->v[2] & uVar90) + (uVar109 & 0x3fffffffffffffff);
    uVar66 = ((long)uVar115 >> 0x3e) + (b->v[3] & uVar90) + (uVar66 & 0x3fffffffffffffff);
    uVar90 = (b->v[4] & uVar90) + lVar118 + ((long)uVar66 >> 0x3e);
    psVar119->v[0] = uVar114 & 0x3fffffffffffffff;
    psVar119->v[1] = uVar117 & 0x3fffffffffffffff;
    psVar119->v[2] = uVar115 & 0x3fffffffffffffff;
    psVar119->v[3] = uVar66 & 0x3fffffffffffffff;
    psVar119->v[4] = uVar90;
    if (0x3fffffffffffffff < uVar90) goto LAB_00142f99;
    iVar64 = secp256k1_modinv64_mul_cmp_62(psVar119,5,b,0);
    if (-1 < iVar64) {
      iVar64 = secp256k1_modinv64_mul_cmp_62(psVar119,5,b,1);
      if (iVar64 < 0) {
        return;
      }
      goto LAB_00142fa3;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00142fa3:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

SECP256K1_INLINE static int secp256k1_scalar_check_overflow(const secp256k1_scalar *a) {
    int yes = 0;
    int no = 0;
    no |= (a->d[3] < SECP256K1_N_3); /* No need for a > check. */
    no |= (a->d[2] < SECP256K1_N_2);
    yes |= (a->d[2] > SECP256K1_N_2) & ~no;
    no |= (a->d[1] < SECP256K1_N_1);
    yes |= (a->d[1] > SECP256K1_N_1) & ~no;
    yes |= (a->d[0] >= SECP256K1_N_0) & ~no;
    return yes;
}